

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O1

void fdct64_avx2(__m256i *input,__m256i *output,int8_t cos_bit,int instride,int outstride)

{
  __m256i *palVar1;
  undefined4 uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  __m256i alVar29;
  __m256i alVar30;
  __m256i alVar31;
  __m256i alVar32;
  __m256i alVar33;
  __m256i alVar34;
  __m256i alVar35;
  __m256i alVar36;
  __m256i alVar37;
  __m256i alVar38;
  __m256i alVar39;
  __m256i alVar40;
  __m256i alVar41;
  __m256i alVar42;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  uint uVar55;
  int iVar56;
  undefined7 in_register_00000011;
  int iVar57;
  long lVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  longlong local_898;
  longlong lStack_890;
  longlong lStack_888;
  longlong lStack_880;
  longlong local_878;
  longlong lStack_870;
  longlong lStack_868;
  longlong lStack_860;
  longlong local_858;
  longlong lStack_850;
  longlong lStack_848;
  longlong lStack_840;
  longlong local_838;
  longlong lStack_830;
  longlong lStack_828;
  longlong lStack_820;
  longlong local_818;
  longlong lStack_810;
  longlong lStack_808;
  longlong lStack_800;
  longlong local_758;
  longlong lStack_750;
  longlong lStack_748;
  longlong lStack_740;
  longlong local_6d8;
  longlong lStack_6d0;
  longlong lStack_6c8;
  longlong lStack_6c0;
  longlong local_6b8;
  longlong lStack_6b0;
  longlong lStack_6a8;
  longlong lStack_6a0;
  longlong local_698;
  longlong lStack_690;
  longlong lStack_688;
  longlong lStack_680;
  longlong local_678;
  longlong lStack_670;
  longlong lStack_668;
  longlong lStack_660;
  longlong local_658;
  longlong lStack_650;
  longlong lStack_648;
  longlong lStack_640;
  longlong local_5d8;
  longlong lStack_5d0;
  longlong lStack_5c8;
  longlong lStack_5c0;
  longlong local_5b8;
  longlong lStack_5b0;
  longlong lStack_5a8;
  longlong lStack_5a0;
  longlong local_598;
  longlong lStack_590;
  longlong lStack_588;
  longlong lStack_580;
  longlong local_578;
  longlong lStack_570;
  longlong lStack_568;
  longlong lStack_560;
  longlong local_558;
  longlong lStack_550;
  longlong lStack_548;
  longlong lStack_540;
  longlong local_538;
  longlong lStack_530;
  longlong lStack_528;
  longlong lStack_520;
  longlong local_518;
  longlong lStack_510;
  longlong lStack_508;
  longlong lStack_500;
  longlong local_4f8;
  longlong lStack_4f0;
  longlong lStack_4e8;
  longlong lStack_4e0;
  longlong local_4d8;
  longlong lStack_4d0;
  longlong lStack_4c8;
  longlong lStack_4c0;
  longlong local_4b8;
  longlong lStack_4b0;
  longlong lStack_4a8;
  longlong lStack_4a0;
  longlong local_498;
  longlong lStack_490;
  longlong lStack_488;
  longlong lStack_480;
  longlong local_478;
  longlong lStack_470;
  longlong lStack_468;
  longlong lStack_460;
  longlong local_458;
  longlong lStack_450;
  longlong lStack_448;
  longlong lStack_440;
  longlong local_438;
  longlong lStack_430;
  longlong lStack_428;
  longlong lStack_420;
  longlong local_418;
  longlong lStack_410;
  longlong lStack_408;
  longlong lStack_400;
  longlong local_3f8;
  longlong lStack_3f0;
  longlong lStack_3e8;
  longlong lStack_3e0;
  longlong local_3d8;
  longlong lStack_3d0;
  longlong lStack_3c8;
  longlong lStack_3c0;
  longlong local_3b8;
  longlong lStack_3b0;
  longlong lStack_3a8;
  longlong lStack_3a0;
  longlong local_398;
  longlong lStack_390;
  longlong lStack_388;
  longlong lStack_380;
  longlong local_378;
  longlong lStack_370;
  longlong lStack_368;
  longlong lStack_360;
  longlong local_358;
  longlong lStack_350;
  longlong lStack_348;
  longlong lStack_340;
  longlong local_338;
  longlong lStack_330;
  longlong lStack_328;
  longlong lStack_320;
  longlong local_318;
  longlong lStack_310;
  longlong lStack_308;
  longlong lStack_300;
  longlong local_298;
  longlong lStack_290;
  longlong lStack_288;
  longlong lStack_280;
  longlong local_278;
  longlong lStack_270;
  longlong lStack_268;
  longlong lStack_260;
  longlong local_258;
  longlong lStack_250;
  longlong lStack_248;
  longlong lStack_240;
  longlong local_238;
  longlong lStack_230;
  longlong lStack_228;
  longlong lStack_220;
  longlong local_218;
  longlong lStack_210;
  longlong lStack_208;
  longlong lStack_200;
  longlong local_1f8;
  longlong lStack_1f0;
  longlong lStack_1e8;
  longlong lStack_1e0;
  longlong local_1d8;
  longlong lStack_1d0;
  longlong lStack_1c8;
  longlong lStack_1c0;
  longlong local_198;
  longlong lStack_190;
  longlong lStack_188;
  longlong lStack_180;
  longlong local_178;
  longlong lStack_170;
  longlong lStack_168;
  longlong lStack_160;
  longlong local_158;
  longlong lStack_150;
  longlong lStack_148;
  longlong lStack_140;
  longlong local_138;
  longlong lStack_130;
  longlong lStack_128;
  longlong lStack_120;
  longlong local_118;
  longlong lStack_110;
  longlong lStack_108;
  longlong lStack_100;
  longlong local_f8;
  longlong lStack_f0;
  longlong lStack_e8;
  longlong lStack_e0;
  longlong local_d8;
  longlong lStack_d0;
  longlong lStack_c8;
  longlong lStack_c0;
  longlong local_b8;
  longlong lStack_b0;
  longlong lStack_a8;
  longlong lStack_a0;
  longlong local_98;
  longlong lStack_90;
  longlong lStack_88;
  longlong lStack_80;
  
  auVar3 = vpaddd_avx2((undefined1  [32])input[0x1f8],(undefined1  [32])*input);
  auVar43 = vpsubd_avx2((undefined1  [32])*input,(undefined1  [32])input[0x1f8]);
  auVar4 = vpaddd_avx2((undefined1  [32])input[0x1f0],(undefined1  [32])input[8]);
  auVar86 = vpsubd_avx2((undefined1  [32])input[8],(undefined1  [32])input[0x1f0]);
  auVar5 = vpaddd_avx2((undefined1  [32])input[0x1e8],(undefined1  [32])input[0x10]);
  auVar71 = vpsubd_avx2((undefined1  [32])input[0x10],(undefined1  [32])input[0x1e8]);
  auVar6 = vpaddd_avx2((undefined1  [32])input[0x1e0],(undefined1  [32])input[0x18]);
  auVar66 = vpsubd_avx2((undefined1  [32])input[0x18],(undefined1  [32])input[0x1e0]);
  auVar7 = vpaddd_avx2((undefined1  [32])input[0x1d8],(undefined1  [32])input[0x20]);
  auVar81 = vpsubd_avx2((undefined1  [32])input[0x20],(undefined1  [32])input[0x1d8]);
  auVar8 = vpaddd_avx2((undefined1  [32])input[0x1d0],(undefined1  [32])input[0x28]);
  auVar82 = vpsubd_avx2((undefined1  [32])input[0x28],(undefined1  [32])input[0x1d0]);
  auVar9 = vpaddd_avx2((undefined1  [32])input[0x1c8],(undefined1  [32])input[0x30]);
  auVar91 = vpsubd_avx2((undefined1  [32])input[0x30],(undefined1  [32])input[0x1c8]);
  auVar10 = vpaddd_avx2((undefined1  [32])input[0x1c0],(undefined1  [32])input[0x38]);
  auVar44 = vpsubd_avx2((undefined1  [32])input[0x38],(undefined1  [32])input[0x1c0]);
  auVar11 = vpaddd_avx2((undefined1  [32])input[0x1b8],(undefined1  [32])input[0x40]);
  auVar45 = vpsubd_avx2((undefined1  [32])input[0x40],(undefined1  [32])input[0x1b8]);
  auVar12 = vpaddd_avx2((undefined1  [32])input[0x1b0],(undefined1  [32])input[0x48]);
  auVar69 = vpsubd_avx2((undefined1  [32])input[0x48],(undefined1  [32])input[0x1b0]);
  auVar13 = vpaddd_avx2((undefined1  [32])input[0x1a8],(undefined1  [32])input[0x50]);
  auVar46 = vpsubd_avx2((undefined1  [32])input[0x50],(undefined1  [32])input[0x1a8]);
  auVar14 = vpaddd_avx2((undefined1  [32])input[0x1a0],(undefined1  [32])input[0x58]);
  auVar47 = vpsubd_avx2((undefined1  [32])input[0x58],(undefined1  [32])input[0x1a0]);
  auVar15 = vpaddd_avx2((undefined1  [32])input[0x198],(undefined1  [32])input[0x60]);
  auVar48 = vpsubd_avx2((undefined1  [32])input[0x60],(undefined1  [32])input[0x198]);
  auVar16 = vpaddd_avx2((undefined1  [32])input[400],(undefined1  [32])input[0x68]);
  auVar49 = vpsubd_avx2((undefined1  [32])input[0x68],(undefined1  [32])input[400]);
  auVar17 = vpaddd_avx2((undefined1  [32])input[0x188],(undefined1  [32])input[0x70]);
  auVar96 = vpsubd_avx2((undefined1  [32])input[0x70],(undefined1  [32])input[0x188]);
  auVar18 = vpaddd_avx2((undefined1  [32])input[0x180],(undefined1  [32])input[0x78]);
  auVar50 = vpsubd_avx2((undefined1  [32])input[0x78],(undefined1  [32])input[0x180]);
  auVar19 = vpaddd_avx2((undefined1  [32])input[0x178],(undefined1  [32])input[0x80]);
  auVar97 = vpsubd_avx2((undefined1  [32])input[0x80],(undefined1  [32])input[0x178]);
  auVar20 = vpaddd_avx2((undefined1  [32])input[0x170],(undefined1  [32])input[0x88]);
  auVar121 = vpsubd_avx2((undefined1  [32])input[0x88],(undefined1  [32])input[0x170]);
  auVar21 = vpaddd_avx2((undefined1  [32])input[0x168],(undefined1  [32])input[0x90]);
  auVar51 = vpsubd_avx2((undefined1  [32])input[0x90],(undefined1  [32])input[0x168]);
  auVar22 = vpaddd_avx2((undefined1  [32])input[0x160],(undefined1  [32])input[0x98]);
  auVar67 = vpsubd_avx2((undefined1  [32])input[0x98],(undefined1  [32])input[0x160]);
  auVar76 = vpaddd_avx2((undefined1  [32])input[0x158],(undefined1  [32])input[0xa0]);
  auVar52 = vpsubd_avx2((undefined1  [32])input[0xa0],(undefined1  [32])input[0x158]);
  auVar23 = vpaddd_avx2((undefined1  [32])input[0x150],(undefined1  [32])input[0xa8]);
  auVar98 = vpsubd_avx2((undefined1  [32])input[0xa8],(undefined1  [32])input[0x150]);
  auVar24 = vpaddd_avx2((undefined1  [32])input[0x148],(undefined1  [32])input[0xb0]);
  auVar53 = vpsubd_avx2((undefined1  [32])input[0xb0],(undefined1  [32])input[0x148]);
  auVar25 = vpaddd_avx2((undefined1  [32])input[0x140],(undefined1  [32])input[0xb8]);
  auVar100 = vpsubd_avx2((undefined1  [32])input[0xb8],(undefined1  [32])input[0x140]);
  auVar26 = vpaddd_avx2((undefined1  [32])input[0x138],(undefined1  [32])input[0xc0]);
  auVar92 = vpsubd_avx2((undefined1  [32])input[0xc0],(undefined1  [32])input[0x138]);
  auVar80 = vpaddd_avx2((undefined1  [32])input[0x130],(undefined1  [32])input[200]);
  auVar93 = vpsubd_avx2((undefined1  [32])input[200],(undefined1  [32])input[0x130]);
  auVar27 = vpaddd_avx2((undefined1  [32])input[0x128],(undefined1  [32])input[0xd0]);
  auVar70 = vpsubd_avx2((undefined1  [32])input[0xd0],(undefined1  [32])input[0x128]);
  auVar95 = vpaddd_avx2((undefined1  [32])input[0x120],(undefined1  [32])input[0xd8]);
  auVar73 = vpsubd_avx2((undefined1  [32])input[0xd8],(undefined1  [32])input[0x120]);
  auVar72 = vpaddd_avx2((undefined1  [32])input[0x118],(undefined1  [32])input[0xe0]);
  auVar122 = vpsubd_avx2((undefined1  [32])input[0xe0],(undefined1  [32])input[0x118]);
  auVar135 = vpaddd_avx2((undefined1  [32])input[0x110],(undefined1  [32])input[0xe8]);
  auVar87 = vpsubd_avx2((undefined1  [32])input[0xe8],(undefined1  [32])input[0x110]);
  auVar84 = vpaddd_avx2((undefined1  [32])input[0x108],(undefined1  [32])input[0xf0]);
  auVar88 = vpsubd_avx2((undefined1  [32])input[0xf0],(undefined1  [32])input[0x108]);
  auVar28 = vpaddd_avx2((undefined1  [32])input[0x100],(undefined1  [32])input[0xf8]);
  auVar77 = vpsubd_avx2((undefined1  [32])input[0xf8],(undefined1  [32])input[0x100]);
  auVar68 = vpaddd_avx2(auVar28,auVar3);
  auVar54 = vpsubd_avx2(auVar3,auVar28);
  auVar3 = vpaddd_avx2(auVar84,auVar4);
  auVar74 = vpsubd_avx2(auVar4,auVar84);
  auVar4 = vpaddd_avx2(auVar135,auVar5);
  auVar78 = vpsubd_avx2(auVar5,auVar135);
  auVar5 = vpaddd_avx2(auVar72,auVar6);
  auVar85 = vpsubd_avx2(auVar6,auVar72);
  auVar6 = vpaddd_avx2(auVar95,auVar7);
  auVar75 = vpsubd_avx2(auVar7,auVar95);
  auVar7 = vpaddd_avx2(auVar27,auVar8);
  auVar79 = vpsubd_avx2(auVar8,auVar27);
  auVar8 = vpaddd_avx2(auVar80,auVar9);
  auVar89 = vpsubd_avx2(auVar9,auVar80);
  auVar9 = vpaddd_avx2(auVar26,auVar10);
  auVar90 = vpsubd_avx2(auVar10,auVar26);
  auVar10 = vpaddd_avx2(auVar25,auVar11);
  auVar94 = vpsubd_avx2(auVar11,auVar25);
  auVar11 = vpaddd_avx2(auVar24,auVar12);
  auVar99 = vpsubd_avx2(auVar12,auVar24);
  auVar12 = vpaddd_avx2(auVar23,auVar13);
  auVar101 = vpsubd_avx2(auVar13,auVar23);
  auVar13 = vpaddd_avx2(auVar76,auVar14);
  auVar102 = vpsubd_avx2(auVar14,auVar76);
  auVar14 = vpaddd_avx2(auVar22,auVar15);
  auVar103 = vpsubd_avx2(auVar15,auVar22);
  auVar15 = vpaddd_avx2(auVar21,auVar16);
  auVar104 = vpsubd_avx2(auVar16,auVar21);
  auVar16 = vpaddd_avx2(auVar20,auVar17);
  auVar105 = vpsubd_avx2(auVar17,auVar20);
  auVar17 = vpaddd_avx2(auVar19,auVar18);
  auVar106 = vpsubd_avx2(auVar18,auVar19);
  uVar55 = (uint)CONCAT71(in_register_00000011,cos_bit);
  lVar58 = (long)(int)uVar55 * 0x100;
  iVar56 = 1 << (cos_bit - 1U & 0x1f);
  auVar83._4_4_ = iVar56;
  auVar83._0_4_ = iVar56;
  auVar83._8_4_ = iVar56;
  auVar83._12_4_ = iVar56;
  auVar83._16_4_ = iVar56;
  auVar83._20_4_ = iVar56;
  auVar83._24_4_ = iVar56;
  auVar83._28_4_ = iVar56;
  iVar56 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x1e0);
  iVar59 = -iVar56;
  auVar140._4_4_ = iVar59;
  auVar140._0_4_ = iVar59;
  auVar140._8_4_ = iVar59;
  auVar140._12_4_ = iVar59;
  auVar140._16_4_ = iVar59;
  auVar140._20_4_ = iVar59;
  auVar140._24_4_ = iVar59;
  auVar140._28_4_ = iVar59;
  auVar143._4_4_ = iVar56;
  auVar143._0_4_ = iVar56;
  auVar143._8_4_ = iVar56;
  auVar143._12_4_ = iVar56;
  auVar143._16_4_ = iVar56;
  auVar143._20_4_ = iVar56;
  auVar143._24_4_ = iVar56;
  auVar143._28_4_ = iVar56;
  auVar18 = vpmulld_avx2(auVar45,auVar143);
  auVar18 = vpaddd_avx2(auVar18,auVar83);
  auVar19 = vpmulld_avx2(auVar100,auVar140);
  auVar18 = vpaddd_avx2(auVar19,auVar18);
  auVar19 = vpmulld_avx2(auVar100,auVar143);
  auVar20 = vpmulld_avx2(auVar140,auVar45);
  auVar20 = vpsubd_avx2(auVar83,auVar20);
  auVar19 = vpaddd_avx2(auVar20,auVar19);
  auVar20 = vpmulld_avx2(auVar69,auVar143);
  auVar20 = vpaddd_avx2(auVar20,auVar83);
  auVar21 = vpmulld_avx2(auVar53,auVar140);
  auVar20 = vpaddd_avx2(auVar21,auVar20);
  auVar21 = vpmulld_avx2(auVar53,auVar143);
  auVar22 = vpmulld_avx2(auVar140,auVar69);
  auVar22 = vpsubd_avx2(auVar83,auVar22);
  auVar21 = vpaddd_avx2(auVar22,auVar21);
  auVar22 = vpmulld_avx2(auVar46,auVar143);
  auVar22 = vpaddd_avx2(auVar22,auVar83);
  auVar76 = vpmulld_avx2(auVar98,auVar140);
  auVar22 = vpaddd_avx2(auVar76,auVar22);
  auVar76 = vpmulld_avx2(auVar98,auVar143);
  auVar23 = vpmulld_avx2(auVar140,auVar46);
  auVar23 = vpsubd_avx2(auVar83,auVar23);
  auVar76 = vpaddd_avx2(auVar23,auVar76);
  auVar23 = vpmulld_avx2(auVar47,auVar143);
  auVar23 = vpaddd_avx2(auVar23,auVar83);
  auVar24 = vpmulld_avx2(auVar52,auVar140);
  auVar23 = vpaddd_avx2(auVar24,auVar23);
  auVar24 = vpmulld_avx2(auVar52,auVar143);
  auVar25 = vpmulld_avx2(auVar140,auVar47);
  auVar25 = vpsubd_avx2(auVar83,auVar25);
  auVar24 = vpaddd_avx2(auVar25,auVar24);
  auVar25 = vpmulld_avx2(auVar48,auVar143);
  auVar25 = vpaddd_avx2(auVar25,auVar83);
  auVar26 = vpmulld_avx2(auVar67,auVar140);
  auVar25 = vpaddd_avx2(auVar26,auVar25);
  auVar26 = vpmulld_avx2(auVar67,auVar143);
  auVar80 = vpmulld_avx2(auVar140,auVar48);
  auVar80 = vpsubd_avx2(auVar83,auVar80);
  auVar26 = vpaddd_avx2(auVar80,auVar26);
  auVar80 = vpmulld_avx2(auVar49,auVar143);
  auVar80 = vpaddd_avx2(auVar80,auVar83);
  auVar27 = vpmulld_avx2(auVar51,auVar140);
  auVar80 = vpaddd_avx2(auVar27,auVar80);
  auVar27 = vpmulld_avx2(auVar51,auVar143);
  auVar95 = vpmulld_avx2(auVar140,auVar49);
  auVar95 = vpsubd_avx2(auVar83,auVar95);
  auVar27 = vpaddd_avx2(auVar95,auVar27);
  auVar95 = vpmulld_avx2(auVar96,auVar143);
  auVar95 = vpaddd_avx2(auVar95,auVar83);
  auVar72 = vpmulld_avx2(auVar121,auVar140);
  auVar95 = vpaddd_avx2(auVar72,auVar95);
  auVar72 = vpmulld_avx2(auVar121,auVar143);
  auVar135 = vpmulld_avx2(auVar140,auVar96);
  auVar135 = vpsubd_avx2(auVar83,auVar135);
  auVar72 = vpaddd_avx2(auVar135,auVar72);
  auVar135 = vpmulld_avx2(auVar50,auVar143);
  auVar135 = vpaddd_avx2(auVar135,auVar83);
  auVar84 = vpmulld_avx2(auVar97,auVar140);
  auVar135 = vpaddd_avx2(auVar84,auVar135);
  auVar84 = vpmulld_avx2(auVar97,auVar143);
  auVar28 = vpmulld_avx2(auVar140,auVar50);
  auVar28 = vpsubd_avx2(auVar83,auVar28);
  auVar84 = vpaddd_avx2(auVar28,auVar84);
  auVar28 = vpaddd_avx2(auVar68,auVar17);
  auVar45 = vpsubd_avx2(auVar68,auVar17);
  auVar17 = vpaddd_avx2(auVar3,auVar16);
  auVar69 = vpsubd_avx2(auVar3,auVar16);
  auVar3 = vpaddd_avx2(auVar4,auVar15);
  auVar46 = vpsubd_avx2(auVar4,auVar15);
  auVar4 = vpaddd_avx2(auVar5,auVar14);
  auVar47 = vpsubd_avx2(auVar5,auVar14);
  auVar5 = vpaddd_avx2(auVar13,auVar6);
  auVar48 = vpsubd_avx2(auVar6,auVar13);
  auVar6 = vpaddd_avx2(auVar7,auVar12);
  auVar49 = vpsubd_avx2(auVar7,auVar12);
  auVar7 = vpaddd_avx2(auVar8,auVar11);
  auVar96 = vpsubd_avx2(auVar8,auVar11);
  auVar68 = vpsrad_avx2(auVar18,ZEXT416(uVar55));
  auVar8 = vpaddd_avx2(auVar9,auVar10);
  auVar50 = vpsubd_avx2(auVar9,auVar10);
  auVar9 = vpmulld_avx2(auVar75,auVar143);
  auVar9 = vpaddd_avx2(auVar83,auVar9);
  auVar10 = vpmulld_avx2(auVar102,auVar140);
  auVar9 = vpaddd_avx2(auVar10,auVar9);
  auVar10 = vpmulld_avx2(auVar102,auVar143);
  auVar11 = vpmulld_avx2(auVar140,auVar75);
  auVar10 = vpaddd_avx2(auVar10,auVar83);
  auVar97 = vpsubd_avx2(auVar10,auVar11);
  auVar10 = vpmulld_avx2(auVar79,auVar143);
  auVar10 = vpaddd_avx2(auVar83,auVar10);
  auVar11 = vpmulld_avx2(auVar101,auVar140);
  auVar10 = vpaddd_avx2(auVar11,auVar10);
  auVar11 = vpmulld_avx2(auVar101,auVar143);
  auVar12 = vpmulld_avx2(auVar140,auVar79);
  auVar11 = vpaddd_avx2(auVar11,auVar83);
  auVar121 = vpsubd_avx2(auVar11,auVar12);
  auVar11 = vpmulld_avx2(auVar89,auVar143);
  auVar11 = vpaddd_avx2(auVar83,auVar11);
  auVar12 = vpmulld_avx2(auVar99,auVar140);
  auVar11 = vpaddd_avx2(auVar12,auVar11);
  auVar12 = vpmulld_avx2(auVar99,auVar143);
  auVar13 = vpmulld_avx2(auVar140,auVar89);
  auVar12 = vpaddd_avx2(auVar12,auVar83);
  auVar51 = vpsubd_avx2(auVar12,auVar13);
  auVar12 = vpmulld_avx2(auVar90,auVar143);
  auVar12 = vpaddd_avx2(auVar83,auVar12);
  auVar13 = vpmulld_avx2(auVar94,auVar140);
  auVar12 = vpaddd_avx2(auVar13,auVar12);
  auVar13 = vpmulld_avx2(auVar94,auVar143);
  auVar14 = vpmulld_avx2(auVar140,auVar90);
  auVar13 = vpaddd_avx2(auVar13,auVar83);
  auVar67 = vpsubd_avx2(auVar13,auVar14);
  auVar14 = vpsrad_avx2(auVar135,ZEXT416(uVar55));
  auVar13 = vpaddd_avx2(auVar77,auVar14);
  auVar52 = vpsubd_avx2(auVar77,auVar14);
  auVar65 = ZEXT416(uVar55);
  auVar15 = vpsrad_avx2(auVar95,auVar65);
  auVar14 = vpaddd_avx2(auVar88,auVar15);
  auVar98 = vpsubd_avx2(auVar88,auVar15);
  auVar16 = vpsrad_avx2(auVar80,auVar65);
  auVar15 = vpaddd_avx2(auVar87,auVar16);
  auVar53 = vpsubd_avx2(auVar87,auVar16);
  auVar18 = vpsrad_avx2(auVar25,auVar65);
  auVar16 = vpaddd_avx2(auVar122,auVar18);
  auVar100 = vpsubd_avx2(auVar122,auVar18);
  auVar23 = vpsrad_avx2(auVar23,auVar65);
  auVar18 = vpaddd_avx2(auVar23,auVar73);
  auVar73 = vpsubd_avx2(auVar73,auVar23);
  auVar65 = ZEXT416(uVar55);
  auVar23 = vpsrad_avx2(auVar22,auVar65);
  auVar22 = vpaddd_avx2(auVar23,auVar70);
  auVar70 = vpsubd_avx2(auVar70,auVar23);
  auVar23 = vpsrad_avx2(auVar20,auVar65);
  auVar20 = vpaddd_avx2(auVar23,auVar93);
  auVar93 = vpsubd_avx2(auVar93,auVar23);
  auVar95 = vpsrad_avx2(auVar19,auVar65);
  auVar19 = vpaddd_avx2(auVar68,auVar92);
  auVar68 = vpsubd_avx2(auVar92,auVar68);
  auVar23 = vpsrad_avx2(auVar84,auVar65);
  auVar92 = vpsubd_avx2(auVar43,auVar23);
  auVar23 = vpaddd_avx2(auVar23,auVar43);
  auVar25 = vpsrad_avx2(auVar72,auVar65);
  auVar43 = vpsubd_avx2(auVar86,auVar25);
  auVar25 = vpaddd_avx2(auVar25,auVar86);
  auVar80 = vpsrad_avx2(auVar27,auVar65);
  auVar86 = vpsubd_avx2(auVar71,auVar80);
  auVar80 = vpaddd_avx2(auVar80,auVar71);
  auVar26 = vpsrad_avx2(auVar26,auVar65);
  auVar71 = vpsubd_avx2(auVar66,auVar26);
  auVar26 = vpaddd_avx2(auVar26,auVar66);
  auVar24 = vpsrad_avx2(auVar24,auVar65);
  auVar66 = vpsubd_avx2(auVar81,auVar24);
  auVar24 = vpaddd_avx2(auVar24,auVar81);
  auVar65 = ZEXT416(uVar55);
  auVar76 = vpsrad_avx2(auVar76,auVar65);
  auVar81 = vpsubd_avx2(auVar82,auVar76);
  auVar76 = vpaddd_avx2(auVar82,auVar76);
  auVar21 = vpsrad_avx2(auVar21,auVar65);
  auVar82 = vpsubd_avx2(auVar91,auVar21);
  auVar21 = vpaddd_avx2(auVar21,auVar91);
  auVar91 = vpsubd_avx2(auVar44,auVar95);
  auVar27 = vpaddd_avx2(auVar95,auVar44);
  auVar95 = vpaddd_avx2(auVar28,auVar8);
  auVar122 = vpsubd_avx2(auVar28,auVar8);
  auVar8 = vpaddd_avx2(auVar17,auVar7);
  auVar44 = vpsubd_avx2(auVar17,auVar7);
  auVar7 = vpaddd_avx2(auVar3,auVar6);
  auVar87 = vpsubd_avx2(auVar3,auVar6);
  auVar17 = vpsrad_avx2(auVar9,auVar65);
  auVar3 = vpaddd_avx2(auVar5,auVar4);
  auVar88 = vpsubd_avx2(auVar4,auVar5);
  auVar4 = vpmulld_avx2(auVar46,auVar143);
  auVar4 = vpaddd_avx2(auVar83,auVar4);
  auVar5 = vpmulld_avx2(auVar49,auVar140);
  auVar4 = vpaddd_avx2(auVar5,auVar4);
  auVar5 = vpmulld_avx2(auVar49,auVar143);
  auVar6 = vpmulld_avx2(auVar140,auVar46);
  auVar5 = vpaddd_avx2(auVar5,auVar83);
  auVar46 = vpsubd_avx2(auVar5,auVar6);
  auVar5 = vpmulld_avx2(auVar47,auVar143);
  auVar5 = vpaddd_avx2(auVar83,auVar5);
  auVar6 = vpmulld_avx2(auVar48,auVar140);
  auVar5 = vpaddd_avx2(auVar6,auVar5);
  auVar6 = vpmulld_avx2(auVar48,auVar143);
  auVar9 = vpmulld_avx2(auVar140,auVar47);
  auVar6 = vpaddd_avx2(auVar6,auVar83);
  auVar47 = vpsubd_avx2(auVar6,auVar9);
  auVar9 = vpsrad_avx2(auVar12,auVar65);
  auVar6 = vpaddd_avx2(auVar9,auVar106);
  auVar48 = vpsubd_avx2(auVar106,auVar9);
  auVar11 = vpsrad_avx2(auVar11,auVar65);
  auVar9 = vpaddd_avx2(auVar11,auVar105);
  auVar49 = vpsubd_avx2(auVar105,auVar11);
  auVar11 = vpsrad_avx2(auVar10,auVar65);
  auVar10 = vpaddd_avx2(auVar11,auVar104);
  auVar77 = vpsubd_avx2(auVar104,auVar11);
  auVar135 = vpsrad_avx2(auVar97,auVar65);
  auVar11 = vpaddd_avx2(auVar17,auVar103);
  auVar97 = vpsubd_avx2(auVar103,auVar17);
  auVar12 = vpsrad_avx2(auVar67,auVar65);
  auVar67 = vpsubd_avx2(auVar54,auVar12);
  auVar12 = vpaddd_avx2(auVar12,auVar54);
  auVar17 = vpsrad_avx2(auVar51,auVar65);
  auVar51 = vpsubd_avx2(auVar74,auVar17);
  auVar17 = vpaddd_avx2(auVar17,auVar74);
  auVar72 = vpsrad_avx2(auVar121,auVar65);
  auVar121 = vpsubd_avx2(auVar78,auVar72);
  auVar72 = vpaddd_avx2(auVar72,auVar78);
  auVar54 = vpsubd_avx2(auVar85,auVar135);
  auVar135 = vpaddd_avx2(auVar135,auVar85);
  iVar56 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x1a0);
  iVar59 = -iVar56;
  auVar118._4_4_ = iVar59;
  auVar118._0_4_ = iVar59;
  auVar118._8_4_ = iVar59;
  auVar118._12_4_ = iVar59;
  auVar118._16_4_ = iVar59;
  auVar118._20_4_ = iVar59;
  auVar118._24_4_ = iVar59;
  auVar118._28_4_ = iVar59;
  iVar59 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x220);
  auVar132._4_4_ = iVar59;
  auVar132._0_4_ = iVar59;
  auVar132._8_4_ = iVar59;
  auVar132._12_4_ = iVar59;
  auVar132._16_4_ = iVar59;
  auVar132._20_4_ = iVar59;
  auVar132._24_4_ = iVar59;
  auVar132._28_4_ = iVar59;
  auVar84 = vpmulld_avx2(auVar18,auVar118);
  auVar84 = vpaddd_avx2(auVar84,auVar83);
  auVar28 = vpmulld_avx2(auVar24,auVar132);
  auVar84 = vpaddd_avx2(auVar84,auVar28);
  auVar18 = vpmulld_avx2(auVar18,auVar132);
  auVar24 = vpmulld_avx2(auVar118,auVar24);
  auVar18 = vpaddd_avx2(auVar18,auVar83);
  auVar74 = vpsubd_avx2(auVar18,auVar24);
  auVar18 = vpmulld_avx2(auVar22,auVar118);
  auVar18 = vpaddd_avx2(auVar18,auVar83);
  auVar24 = vpmulld_avx2(auVar76,auVar132);
  auVar18 = vpaddd_avx2(auVar24,auVar18);
  auVar22 = vpmulld_avx2(auVar22,auVar132);
  auVar76 = vpmulld_avx2(auVar118,auVar76);
  auVar22 = vpaddd_avx2(auVar22,auVar83);
  auVar78 = vpsubd_avx2(auVar22,auVar76);
  auVar22 = vpmulld_avx2(auVar20,auVar118);
  auVar22 = vpaddd_avx2(auVar22,auVar83);
  auVar76 = vpmulld_avx2(auVar21,auVar132);
  auVar22 = vpaddd_avx2(auVar22,auVar76);
  auVar20 = vpmulld_avx2(auVar20,auVar132);
  auVar21 = vpmulld_avx2(auVar118,auVar21);
  auVar20 = vpaddd_avx2(auVar20,auVar83);
  auVar85 = vpsubd_avx2(auVar20,auVar21);
  auVar20 = vpmulld_avx2(auVar19,auVar118);
  auVar20 = vpaddd_avx2(auVar20,auVar83);
  auVar21 = vpmulld_avx2(auVar27,auVar132);
  auVar20 = vpaddd_avx2(auVar20,auVar21);
  auVar19 = vpmulld_avx2(auVar19,auVar132);
  auVar21 = vpmulld_avx2(auVar118,auVar27);
  auVar19 = vpaddd_avx2(auVar19,auVar83);
  auVar75 = vpsubd_avx2(auVar19,auVar21);
  iVar59 = -iVar59;
  auVar134._4_4_ = iVar59;
  auVar134._0_4_ = iVar59;
  auVar134._8_4_ = iVar59;
  auVar134._12_4_ = iVar59;
  auVar134._16_4_ = iVar59;
  auVar134._20_4_ = iVar59;
  auVar134._24_4_ = iVar59;
  auVar134._28_4_ = iVar59;
  auVar19 = vpmulld_avx2(auVar68,auVar134);
  auVar19 = vpaddd_avx2(auVar19,auVar83);
  auVar21 = vpmulld_avx2(auVar91,auVar118);
  auVar19 = vpaddd_avx2(auVar21,auVar19);
  auVar21 = vpmulld_avx2(auVar68,auVar118);
  auVar76 = vpmulld_avx2(auVar134,auVar91);
  auVar21 = vpaddd_avx2(auVar21,auVar83);
  auVar91 = vpsubd_avx2(auVar21,auVar76);
  auVar21 = vpmulld_avx2(auVar93,auVar134);
  auVar21 = vpaddd_avx2(auVar21,auVar83);
  auVar76 = vpmulld_avx2(auVar82,auVar118);
  auVar21 = vpaddd_avx2(auVar76,auVar21);
  auVar76 = vpmulld_avx2(auVar93,auVar118);
  auVar24 = vpmulld_avx2(auVar134,auVar82);
  auVar76 = vpaddd_avx2(auVar76,auVar83);
  auVar82 = vpsubd_avx2(auVar76,auVar24);
  auVar76 = vpmulld_avx2(auVar70,auVar134);
  auVar76 = vpaddd_avx2(auVar76,auVar83);
  auVar24 = vpmulld_avx2(auVar81,auVar118);
  auVar76 = vpaddd_avx2(auVar24,auVar76);
  auVar24 = vpmulld_avx2(auVar70,auVar118);
  auVar27 = vpmulld_avx2(auVar134,auVar81);
  auVar24 = vpaddd_avx2(auVar24,auVar83);
  auVar81 = vpsubd_avx2(auVar24,auVar27);
  auVar24 = vpmulld_avx2(auVar73,auVar134);
  auVar24 = vpaddd_avx2(auVar24,auVar83);
  auVar27 = vpmulld_avx2(auVar66,auVar118);
  auVar24 = vpaddd_avx2(auVar27,auVar24);
  auVar27 = vpmulld_avx2(auVar73,auVar118);
  auVar28 = vpmulld_avx2(auVar134,auVar66);
  auVar27 = vpaddd_avx2(auVar27,auVar83);
  auVar66 = vpsubd_avx2(auVar27,auVar28);
  auVar27 = vpaddd_avx2(auVar95,auVar3);
  auVar93 = vpsubd_avx2(auVar95,auVar3);
  auVar3 = vpaddd_avx2(auVar8,auVar7);
  auVar70 = vpsubd_avx2(auVar8,auVar7);
  auVar7 = vpmulld_avx2(auVar44,auVar143);
  auVar7 = vpaddd_avx2(auVar7,auVar83);
  auVar8 = vpmulld_avx2(auVar87,auVar140);
  auVar7 = vpaddd_avx2(auVar8,auVar7);
  auVar95 = vpmulld_avx2(auVar140,auVar44);
  auVar8 = vpmulld_avx2(auVar87,auVar143);
  auVar8 = vpaddd_avx2(auVar8,auVar83);
  auVar73 = vpsubd_avx2(auVar8,auVar95);
  auVar8 = vpsrad_avx2(auVar5,auVar65);
  auVar5 = vpaddd_avx2(auVar50,auVar8);
  auVar50 = vpsubd_avx2(auVar50,auVar8);
  auVar8 = vpsrad_avx2(auVar4,auVar65);
  auVar4 = vpaddd_avx2(auVar8,auVar96);
  auVar96 = vpsubd_avx2(auVar96,auVar8);
  auVar8 = vpsrad_avx2(auVar47,auVar65);
  auVar47 = vpsubd_avx2(auVar45,auVar8);
  auVar8 = vpaddd_avx2(auVar45,auVar8);
  auVar95 = vpsrad_avx2(auVar46,auVar65);
  auVar46 = vpsubd_avx2(auVar69,auVar95);
  auVar95 = vpaddd_avx2(auVar95,auVar69);
  auVar28 = vpmulld_avx2(auVar10,auVar118);
  auVar28 = vpaddd_avx2(auVar28,auVar83);
  auVar68 = vpmulld_avx2(auVar72,auVar132);
  auVar28 = vpaddd_avx2(auVar28,auVar68);
  auVar10 = vpmulld_avx2(auVar10,auVar132);
  auVar72 = vpmulld_avx2(auVar118,auVar72);
  auVar10 = vpaddd_avx2(auVar10,auVar83);
  auVar69 = vpsubd_avx2(auVar10,auVar72);
  auVar10 = vpmulld_avx2(auVar11,auVar118);
  auVar10 = vpaddd_avx2(auVar10,auVar83);
  auVar72 = vpmulld_avx2(auVar135,auVar132);
  auVar10 = vpaddd_avx2(auVar10,auVar72);
  auVar11 = vpmulld_avx2(auVar11,auVar132);
  auVar72 = vpmulld_avx2(auVar118,auVar135);
  auVar11 = vpaddd_avx2(auVar11,auVar83);
  auVar87 = vpsubd_avx2(auVar11,auVar72);
  auVar11 = vpmulld_avx2(auVar97,auVar134);
  auVar11 = vpaddd_avx2(auVar11,auVar83);
  auVar72 = vpmulld_avx2(auVar54,auVar118);
  auVar11 = vpaddd_avx2(auVar11,auVar72);
  auVar72 = vpmulld_avx2(auVar97,auVar118);
  auVar135 = vpmulld_avx2(auVar134,auVar54);
  auVar72 = vpaddd_avx2(auVar72,auVar83);
  auVar97 = vpsubd_avx2(auVar72,auVar135);
  auVar72 = vpmulld_avx2(auVar77,auVar134);
  auVar72 = vpaddd_avx2(auVar72,auVar83);
  auVar135 = vpmulld_avx2(auVar121,auVar118);
  auVar72 = vpaddd_avx2(auVar72,auVar135);
  auVar135 = vpmulld_avx2(auVar77,auVar118);
  auVar68 = vpmulld_avx2(auVar134,auVar121);
  auVar135 = vpaddd_avx2(auVar135,auVar83);
  auVar121 = vpsubd_avx2(auVar135,auVar68);
  auVar135 = vpsrad_avx2(auVar20,auVar65);
  auVar20 = vpaddd_avx2(auVar135,auVar13);
  auVar77 = vpsubd_avx2(auVar13,auVar135);
  auVar22 = vpsrad_avx2(auVar22,auVar65);
  auVar13 = vpaddd_avx2(auVar22,auVar14);
  auVar54 = vpsubd_avx2(auVar14,auVar22);
  auVar65 = ZEXT416(uVar55);
  auVar18 = vpsrad_avx2(auVar18,auVar65);
  auVar14 = vpaddd_avx2(auVar18,auVar15);
  auVar79 = vpsubd_avx2(auVar15,auVar18);
  auVar18 = vpsrad_avx2(auVar84,auVar65);
  auVar15 = vpaddd_avx2(auVar18,auVar16);
  auVar89 = vpsubd_avx2(auVar16,auVar18);
  auVar16 = vpsrad_avx2(auVar19,auVar65);
  auVar90 = vpsubd_avx2(auVar52,auVar16);
  auVar16 = vpaddd_avx2(auVar16,auVar52);
  auVar18 = vpsrad_avx2(auVar21,auVar65);
  auVar52 = vpsubd_avx2(auVar98,auVar18);
  auVar18 = vpaddd_avx2(auVar18,auVar98);
  auVar19 = vpsrad_avx2(auVar76,auVar65);
  auVar98 = vpsubd_avx2(auVar53,auVar19);
  auVar19 = vpaddd_avx2(auVar19,auVar53);
  auVar21 = vpsrad_avx2(auVar24,auVar65);
  auVar53 = vpsubd_avx2(auVar100,auVar21);
  auVar21 = vpaddd_avx2(auVar21,auVar100);
  auVar76 = vpsrad_avx2(auVar91,auVar65);
  auVar22 = vpaddd_avx2(auVar76,auVar92);
  auVar91 = vpsubd_avx2(auVar92,auVar76);
  auVar24 = vpsrad_avx2(auVar82,auVar65);
  auVar76 = vpaddd_avx2(auVar24,auVar43);
  auVar82 = vpsubd_avx2(auVar43,auVar24);
  auVar135 = vpsrad_avx2(auVar81,auVar65);
  auVar24 = vpaddd_avx2(auVar135,auVar86);
  auVar86 = vpsubd_avx2(auVar86,auVar135);
  auVar84 = vpsrad_avx2(auVar66,auVar65);
  auVar135 = vpaddd_avx2(auVar84,auVar71);
  auVar71 = vpsubd_avx2(auVar71,auVar84);
  auVar84 = vpsrad_avx2(auVar75,auVar65);
  auVar81 = vpsubd_avx2(auVar23,auVar84);
  auVar23 = vpaddd_avx2(auVar23,auVar84);
  auVar84 = vpsrad_avx2(auVar85,auVar65);
  auVar100 = vpsubd_avx2(auVar25,auVar84);
  auVar25 = vpaddd_avx2(auVar25,auVar84);
  auVar84 = vpsrad_avx2(auVar78,auVar65);
  auVar66 = vpsubd_avx2(auVar80,auVar84);
  auVar80 = vpaddd_avx2(auVar84,auVar80);
  auVar84 = vpsrad_avx2(auVar74,auVar65);
  auVar92 = vpsubd_avx2(auVar26,auVar84);
  auVar26 = vpaddd_avx2(auVar84,auVar26);
  auVar84 = vpaddd_avx2(auVar27,auVar3);
  auVar3 = vpsubd_avx2(auVar27,auVar3);
  auVar44 = vpmulld_avx2(auVar84,auVar143);
  auVar45 = vpmulld_avx2(auVar3,auVar143);
  auVar84._4_4_ = iVar56;
  auVar84._0_4_ = iVar56;
  auVar84._8_4_ = iVar56;
  auVar84._12_4_ = iVar56;
  auVar84._16_4_ = iVar56;
  auVar84._20_4_ = iVar56;
  auVar84._24_4_ = iVar56;
  auVar84._28_4_ = iVar56;
  auVar3 = vpmulld_avx2(auVar70,auVar132);
  auVar3 = vpaddd_avx2(auVar3,auVar83);
  auVar27 = vpmulld_avx2(auVar93,auVar84);
  auVar3 = vpaddd_avx2(auVar3,auVar27);
  auVar27 = vpmulld_avx2(auVar84,auVar70);
  auVar84 = vpmulld_avx2(auVar93,auVar132);
  auVar27 = vpsubd_avx2(auVar83,auVar27);
  auVar27 = vpaddd_avx2(auVar84,auVar27);
  auVar84 = vpsrad_avx2(auVar7,auVar65);
  auVar7 = vpaddd_avx2(auVar88,auVar84);
  auVar93 = vpsubd_avx2(auVar88,auVar84);
  auVar84 = vpsrad_avx2(auVar73,auVar65);
  auVar70 = vpsubd_avx2(auVar122,auVar84);
  auVar84 = vpaddd_avx2(auVar122,auVar84);
  auVar68 = vpmulld_avx2(auVar4,auVar118);
  auVar68 = vpaddd_avx2(auVar68,auVar83);
  auVar43 = vpmulld_avx2(auVar95,auVar132);
  auVar68 = vpaddd_avx2(auVar43,auVar68);
  auVar4 = vpmulld_avx2(auVar4,auVar132);
  auVar95 = vpmulld_avx2(auVar118,auVar95);
  auVar4 = vpaddd_avx2(auVar4,auVar83);
  auVar73 = vpsubd_avx2(auVar4,auVar95);
  auVar4 = vpmulld_avx2(auVar96,auVar134);
  auVar4 = vpaddd_avx2(auVar4,auVar83);
  auVar95 = vpmulld_avx2(auVar46,auVar118);
  auVar4 = vpaddd_avx2(auVar4,auVar95);
  auVar95 = vpmulld_avx2(auVar96,auVar118);
  auVar43 = vpmulld_avx2(auVar134,auVar46);
  auVar95 = vpaddd_avx2(auVar95,auVar83);
  auVar46 = vpsubd_avx2(auVar95,auVar43);
  auVar95 = vpsrad_avx2(auVar10,auVar65);
  auVar10 = vpaddd_avx2(auVar95,auVar6);
  auVar96 = vpsubd_avx2(auVar6,auVar95);
  auVar95 = vpsrad_avx2(auVar28,auVar65);
  auVar6 = vpaddd_avx2(auVar95,auVar9);
  auVar122 = vpsubd_avx2(auVar9,auVar95);
  auVar9 = vpsrad_avx2(auVar11,auVar65);
  auVar88 = vpsubd_avx2(auVar48,auVar9);
  auVar9 = vpaddd_avx2(auVar9,auVar48);
  auVar11 = vpsrad_avx2(auVar72,auVar65);
  auVar48 = vpsubd_avx2(auVar49,auVar11);
  auVar11 = vpaddd_avx2(auVar11,auVar49);
  auVar72 = vpsrad_avx2(auVar97,auVar65);
  auVar95 = vpaddd_avx2(auVar72,auVar67);
  auVar49 = vpsubd_avx2(auVar67,auVar72);
  auVar28 = vpsrad_avx2(auVar121,auVar65);
  auVar72 = vpaddd_avx2(auVar28,auVar51);
  auVar97 = vpsubd_avx2(auVar51,auVar28);
  auVar28 = vpsrad_avx2(auVar87,auVar65);
  auVar121 = vpsubd_avx2(auVar12,auVar28);
  auVar12 = vpaddd_avx2(auVar28,auVar12);
  auVar28 = vpsrad_avx2(auVar69,auVar65);
  auVar69 = vpsubd_avx2(auVar17,auVar28);
  auVar17 = vpaddd_avx2(auVar28,auVar17);
  iVar56 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x180);
  iVar59 = -iVar56;
  auVar85._4_4_ = iVar59;
  auVar85._0_4_ = iVar59;
  auVar85._8_4_ = iVar59;
  auVar85._12_4_ = iVar59;
  auVar85._16_4_ = iVar59;
  auVar85._20_4_ = iVar59;
  auVar85._24_4_ = iVar59;
  auVar85._28_4_ = iVar59;
  iVar59 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x240);
  auVar119._4_4_ = iVar59;
  auVar119._0_4_ = iVar59;
  auVar119._8_4_ = iVar59;
  auVar119._12_4_ = iVar59;
  auVar119._16_4_ = iVar59;
  auVar119._20_4_ = iVar59;
  auVar119._24_4_ = iVar59;
  auVar119._28_4_ = iVar59;
  auVar28 = vpmulld_avx2(auVar14,auVar85);
  auVar28 = vpaddd_avx2(auVar28,auVar83);
  auVar43 = vpmulld_avx2(auVar80,auVar119);
  auVar28 = vpaddd_avx2(auVar28,auVar43);
  auVar14 = vpmulld_avx2(auVar14,auVar119);
  auVar80 = vpmulld_avx2(auVar85,auVar80);
  auVar14 = vpaddd_avx2(auVar14,auVar83);
  auVar51 = vpsubd_avx2(auVar14,auVar80);
  auVar14 = vpmulld_avx2(auVar15,auVar85);
  auVar14 = vpaddd_avx2(auVar14,auVar83);
  auVar80 = vpmulld_avx2(auVar26,auVar119);
  auVar14 = vpaddd_avx2(auVar14,auVar80);
  auVar15 = vpmulld_avx2(auVar15,auVar119);
  auVar26 = vpmulld_avx2(auVar85,auVar26);
  auVar15 = vpaddd_avx2(auVar15,auVar83);
  auVar67 = vpsubd_avx2(auVar15,auVar26);
  iVar59 = -iVar59;
  auVar139._4_4_ = iVar59;
  auVar139._0_4_ = iVar59;
  auVar139._8_4_ = iVar59;
  auVar139._12_4_ = iVar59;
  auVar139._16_4_ = iVar59;
  auVar139._20_4_ = iVar59;
  auVar139._24_4_ = iVar59;
  auVar139._28_4_ = iVar59;
  auVar15 = vpmulld_avx2(auVar89,auVar139);
  auVar15 = vpaddd_avx2(auVar15,auVar83);
  auVar26 = vpmulld_avx2(auVar92,auVar85);
  auVar15 = vpaddd_avx2(auVar15,auVar26);
  auVar26 = vpmulld_avx2(auVar89,auVar85);
  auVar80 = vpmulld_avx2(auVar139,auVar92);
  auVar26 = vpaddd_avx2(auVar26,auVar83);
  auVar92 = vpsubd_avx2(auVar26,auVar80);
  auVar26 = vpmulld_avx2(auVar79,auVar139);
  auVar26 = vpaddd_avx2(auVar26,auVar83);
  auVar80 = vpmulld_avx2(auVar66,auVar85);
  auVar26 = vpaddd_avx2(auVar26,auVar80);
  auVar80 = vpmulld_avx2(auVar79,auVar85);
  auVar43 = vpmulld_avx2(auVar139,auVar66);
  auVar80 = vpaddd_avx2(auVar80,auVar83);
  auVar87 = vpsubd_avx2(auVar80,auVar43);
  iVar59 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x200);
  iVar60 = -iVar59;
  auVar133._4_4_ = iVar60;
  auVar133._0_4_ = iVar60;
  auVar133._8_4_ = iVar60;
  auVar133._12_4_ = iVar60;
  auVar133._16_4_ = iVar60;
  auVar133._20_4_ = iVar60;
  auVar133._24_4_ = iVar60;
  auVar133._28_4_ = iVar60;
  iVar60 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x1c0);
  auVar142._4_4_ = iVar60;
  auVar142._0_4_ = iVar60;
  auVar142._8_4_ = iVar60;
  auVar142._12_4_ = iVar60;
  auVar142._16_4_ = iVar60;
  auVar142._20_4_ = iVar60;
  auVar142._24_4_ = iVar60;
  auVar142._28_4_ = iVar60;
  auVar80 = vpmulld_avx2(auVar98,auVar133);
  auVar80 = vpaddd_avx2(auVar80,auVar83);
  auVar43 = vpmulld_avx2(auVar86,auVar142);
  auVar80 = vpaddd_avx2(auVar80,auVar43);
  auVar43 = vpmulld_avx2(auVar98,auVar142);
  auVar86 = vpmulld_avx2(auVar133,auVar86);
  auVar43 = vpaddd_avx2(auVar43,auVar83);
  auVar98 = vpsubd_avx2(auVar43,auVar86);
  auVar43 = vpmulld_avx2(auVar53,auVar133);
  auVar43 = vpaddd_avx2(auVar43,auVar83);
  auVar86 = vpmulld_avx2(auVar71,auVar142);
  auVar43 = vpaddd_avx2(auVar43,auVar86);
  auVar86 = vpmulld_avx2(auVar53,auVar142);
  auVar71 = vpmulld_avx2(auVar133,auVar71);
  auVar86 = vpaddd_avx2(auVar86,auVar83);
  auVar53 = vpsubd_avx2(auVar86,auVar71);
  iVar60 = -iVar60;
  auVar99._4_4_ = iVar60;
  auVar99._0_4_ = iVar60;
  auVar99._8_4_ = iVar60;
  auVar99._12_4_ = iVar60;
  auVar99._16_4_ = iVar60;
  auVar99._20_4_ = iVar60;
  auVar99._24_4_ = iVar60;
  auVar99._28_4_ = iVar60;
  auVar86 = vpmulld_avx2(auVar21,auVar99);
  auVar86 = vpaddd_avx2(auVar86,auVar83);
  auVar71 = vpmulld_avx2(auVar135,auVar133);
  auVar86 = vpaddd_avx2(auVar71,auVar86);
  auVar21 = vpmulld_avx2(auVar21,auVar133);
  auVar135 = vpmulld_avx2(auVar99,auVar135);
  auVar21 = vpaddd_avx2(auVar21,auVar83);
  auVar74 = vpsubd_avx2(auVar21,auVar135);
  auVar21 = vpmulld_avx2(auVar19,auVar99);
  auVar21 = vpaddd_avx2(auVar21,auVar83);
  auVar135 = vpmulld_avx2(auVar24,auVar133);
  auVar21 = vpaddd_avx2(auVar135,auVar21);
  auVar19 = vpmulld_avx2(auVar19,auVar133);
  auVar24 = vpmulld_avx2(auVar99,auVar24);
  auVar19 = vpaddd_avx2(auVar19,auVar83);
  auVar78 = vpsubd_avx2(auVar19,auVar24);
  auVar135._4_4_ = iVar56;
  auVar135._0_4_ = iVar56;
  auVar135._8_4_ = iVar56;
  auVar135._12_4_ = iVar56;
  auVar135._16_4_ = iVar56;
  auVar135._20_4_ = iVar56;
  auVar135._24_4_ = iVar56;
  auVar135._28_4_ = iVar56;
  auVar19 = vpmulld_avx2(auVar7,auVar119);
  auVar19 = vpaddd_avx2(auVar19,auVar83);
  auVar24 = vpmulld_avx2(auVar84,auVar135);
  auVar19 = vpaddd_avx2(auVar19,auVar24);
  auVar7 = vpmulld_avx2(auVar135,auVar7);
  auVar24 = vpmulld_avx2(auVar84,auVar119);
  auVar7 = vpsubd_avx2(auVar83,auVar7);
  auVar7 = vpaddd_avx2(auVar24,auVar7);
  auVar136._4_4_ = iVar59;
  auVar136._0_4_ = iVar59;
  auVar136._8_4_ = iVar59;
  auVar136._12_4_ = iVar59;
  auVar136._16_4_ = iVar59;
  auVar136._20_4_ = iVar59;
  auVar136._24_4_ = iVar59;
  auVar136._28_4_ = iVar59;
  auVar24 = vpmulld_avx2(auVar93,auVar142);
  auVar24 = vpaddd_avx2(auVar24,auVar83);
  auVar135 = vpmulld_avx2(auVar70,auVar136);
  auVar24 = vpaddd_avx2(auVar24,auVar135);
  auVar135 = vpmulld_avx2(auVar136,auVar93);
  auVar84 = vpmulld_avx2(auVar70,auVar142);
  auVar135 = vpsubd_avx2(auVar83,auVar135);
  auVar135 = vpaddd_avx2(auVar84,auVar135);
  auVar68 = vpsrad_avx2(auVar68,auVar65);
  auVar84 = vpaddd_avx2(auVar5,auVar68);
  auVar93 = vpsubd_avx2(auVar5,auVar68);
  auVar4 = vpsrad_avx2(auVar4,auVar65);
  auVar70 = vpsubd_avx2(auVar50,auVar4);
  auVar4 = vpaddd_avx2(auVar50,auVar4);
  auVar68 = vpsrad_avx2(auVar46,auVar65);
  auVar5 = vpaddd_avx2(auVar47,auVar68);
  auVar46 = vpsubd_avx2(auVar47,auVar68);
  auVar68 = vpsrad_avx2(auVar73,auVar65);
  auVar47 = vpsubd_avx2(auVar8,auVar68);
  auVar8 = vpaddd_avx2(auVar8,auVar68);
  auVar68 = vpmulld_avx2(auVar6,auVar85);
  auVar68 = vpaddd_avx2(auVar68,auVar83);
  auVar71 = vpmulld_avx2(auVar17,auVar119);
  auVar68 = vpaddd_avx2(auVar68,auVar71);
  auVar6 = vpmulld_avx2(auVar6,auVar119);
  auVar17 = vpmulld_avx2(auVar85,auVar17);
  auVar6 = vpaddd_avx2(auVar6,auVar83);
  auVar50 = vpsubd_avx2(auVar6,auVar17);
  auVar6 = vpmulld_avx2(auVar122,auVar139);
  auVar6 = vpaddd_avx2(auVar6,auVar83);
  auVar17 = vpmulld_avx2(auVar69,auVar85);
  auVar6 = vpaddd_avx2(auVar17,auVar6);
  auVar17 = vpmulld_avx2(auVar122,auVar85);
  auVar71 = vpmulld_avx2(auVar139,auVar69);
  auVar17 = vpaddd_avx2(auVar17,auVar83);
  auVar69 = vpsubd_avx2(auVar17,auVar71);
  auVar17 = vpmulld_avx2(auVar48,auVar133);
  auVar17 = vpaddd_avx2(auVar17,auVar83);
  auVar71 = vpmulld_avx2(auVar97,auVar142);
  auVar17 = vpaddd_avx2(auVar17,auVar71);
  auVar71 = vpmulld_avx2(auVar48,auVar142);
  auVar66 = vpmulld_avx2(auVar133,auVar97);
  auVar71 = vpaddd_avx2(auVar71,auVar83);
  auVar48 = vpsubd_avx2(auVar71,auVar66);
  auVar71 = vpmulld_avx2(auVar11,auVar99);
  auVar71 = vpaddd_avx2(auVar71,auVar83);
  auVar66 = vpmulld_avx2(auVar72,auVar133);
  auVar71 = vpaddd_avx2(auVar71,auVar66);
  auVar11 = vpmulld_avx2(auVar11,auVar133);
  auVar72 = vpmulld_avx2(auVar99,auVar72);
  auVar11 = vpaddd_avx2(auVar11,auVar83);
  auVar97 = vpsubd_avx2(auVar11,auVar72);
  auVar14 = vpsrad_avx2(auVar14,auVar65);
  auVar11 = vpaddd_avx2(auVar14,auVar20);
  auVar73 = vpsubd_avx2(auVar20,auVar14);
  auVar20 = vpsrad_avx2(auVar28,auVar65);
  auVar14 = vpaddd_avx2(auVar20,auVar13);
  auVar122 = vpsubd_avx2(auVar13,auVar20);
  auVar13 = vpsrad_avx2(auVar15,auVar65);
  auVar85 = vpsubd_avx2(auVar77,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar77);
  auVar15 = vpsrad_avx2(auVar26,auVar65);
  auVar77 = vpsubd_avx2(auVar54,auVar15);
  auVar15 = vpaddd_avx2(auVar15,auVar54);
  auVar65 = ZEXT416(uVar55);
  auVar26 = vpsrad_avx2(auVar43,auVar65);
  auVar20 = vpaddd_avx2(auVar26,auVar90);
  auVar54 = vpsubd_avx2(auVar90,auVar26);
  auVar80 = vpsrad_avx2(auVar80,auVar65);
  auVar26 = vpaddd_avx2(auVar80,auVar52);
  auVar52 = vpsubd_avx2(auVar52,auVar80);
  auVar80 = vpsrad_avx2(auVar86,auVar65);
  auVar75 = vpsubd_avx2(auVar16,auVar80);
  auVar16 = vpaddd_avx2(auVar80,auVar16);
  auVar21 = vpsrad_avx2(auVar21,auVar65);
  auVar79 = vpsubd_avx2(auVar18,auVar21);
  auVar18 = vpaddd_avx2(auVar21,auVar18);
  auVar80 = vpsrad_avx2(auVar74,auVar65);
  auVar21 = vpaddd_avx2(auVar80,auVar22);
  auVar74 = vpsubd_avx2(auVar22,auVar80);
  auVar80 = vpsrad_avx2(auVar78,auVar65);
  auVar22 = vpaddd_avx2(auVar80,auVar76);
  auVar78 = vpsubd_avx2(auVar76,auVar80);
  auVar76 = vpsrad_avx2(auVar53,auVar65);
  auVar53 = vpsubd_avx2(auVar91,auVar76);
  auVar76 = vpaddd_avx2(auVar76,auVar91);
  auVar80 = vpsrad_avx2(auVar98,auVar65);
  auVar91 = vpsubd_avx2(auVar82,auVar80);
  auVar80 = vpaddd_avx2(auVar80,auVar82);
  auVar28 = vpsrad_avx2(auVar92,auVar65);
  auVar72 = vpaddd_avx2(auVar28,auVar81);
  auVar98 = vpsubd_avx2(auVar81,auVar28);
  auVar43 = vpsrad_avx2(auVar87,auVar65);
  auVar28 = vpaddd_avx2(auVar43,auVar100);
  auVar81 = vpsubd_avx2(auVar100,auVar43);
  auVar43 = vpsrad_avx2(auVar67,auVar65);
  auVar67 = vpsubd_avx2(auVar23,auVar43);
  auVar23 = vpaddd_avx2(auVar43,auVar23);
  auVar43 = vpsrad_avx2(auVar51,auVar65);
  auVar82 = vpsubd_avx2(auVar25,auVar43);
  auVar25 = vpaddd_avx2(auVar43,auVar25);
  iVar56 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x170);
  iVar59 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x250);
  auVar120._4_4_ = iVar59;
  auVar120._0_4_ = iVar59;
  auVar120._8_4_ = iVar59;
  auVar120._12_4_ = iVar59;
  auVar120._16_4_ = iVar59;
  auVar120._20_4_ = iVar59;
  auVar120._24_4_ = iVar59;
  auVar120._28_4_ = iVar59;
  auVar66._4_4_ = iVar56;
  auVar66._0_4_ = iVar56;
  auVar66._8_4_ = iVar56;
  auVar66._12_4_ = iVar56;
  auVar66._16_4_ = iVar56;
  auVar66._20_4_ = iVar56;
  auVar66._24_4_ = iVar56;
  auVar66._28_4_ = iVar56;
  auVar43 = vpmulld_avx2(auVar120,auVar84);
  auVar43 = vpaddd_avx2(auVar43,auVar83);
  auVar86 = vpmulld_avx2(auVar66,auVar8);
  auVar43 = vpaddd_avx2(auVar43,auVar86);
  auVar84 = vpmulld_avx2(auVar84,auVar66);
  auVar8 = vpmulld_avx2(auVar120,auVar8);
  auVar8 = vpaddd_avx2(auVar8,auVar83);
  auVar51 = vpsubd_avx2(auVar8,auVar84);
  iVar60 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x1d0);
  auVar141._4_4_ = iVar60;
  auVar141._0_4_ = iVar60;
  auVar141._8_4_ = iVar60;
  auVar141._12_4_ = iVar60;
  auVar141._16_4_ = iVar60;
  auVar141._20_4_ = iVar60;
  auVar141._24_4_ = iVar60;
  auVar141._28_4_ = iVar60;
  iVar64 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x1f0);
  auVar86._4_4_ = iVar64;
  auVar86._0_4_ = iVar64;
  auVar86._8_4_ = iVar64;
  auVar86._12_4_ = iVar64;
  auVar86._16_4_ = iVar64;
  auVar86._20_4_ = iVar64;
  auVar86._24_4_ = iVar64;
  auVar86._28_4_ = iVar64;
  auVar8 = vpmulld_avx2(auVar141,auVar93);
  auVar8 = vpaddd_avx2(auVar8,auVar83);
  auVar84 = vpmulld_avx2(auVar86,auVar47);
  auVar8 = vpaddd_avx2(auVar8,auVar84);
  auVar86 = vpmulld_avx2(auVar93,auVar86);
  auVar84 = vpmulld_avx2(auVar141,auVar47);
  auVar84 = vpaddd_avx2(auVar84,auVar83);
  auVar47 = vpsubd_avx2(auVar84,auVar86);
  iVar62 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x210);
  auVar87._4_4_ = iVar62;
  auVar87._0_4_ = iVar62;
  auVar87._8_4_ = iVar62;
  auVar87._12_4_ = iVar62;
  auVar87._16_4_ = iVar62;
  auVar87._20_4_ = iVar62;
  auVar87._24_4_ = iVar62;
  auVar87._28_4_ = iVar62;
  iVar57 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x1b0);
  auVar100._4_4_ = iVar57;
  auVar100._0_4_ = iVar57;
  auVar100._8_4_ = iVar57;
  auVar100._12_4_ = iVar57;
  auVar100._16_4_ = iVar57;
  auVar100._20_4_ = iVar57;
  auVar100._24_4_ = iVar57;
  auVar100._28_4_ = iVar57;
  auVar84 = vpmulld_avx2(auVar87,auVar70);
  auVar84 = vpaddd_avx2(auVar84,auVar83);
  auVar86 = vpmulld_avx2(auVar100,auVar46);
  auVar84 = vpaddd_avx2(auVar86,auVar84);
  auVar66 = vpmulld_avx2(auVar70,auVar100);
  auVar86 = vpmulld_avx2(auVar87,auVar46);
  auVar86 = vpaddd_avx2(auVar86,auVar83);
  auVar46 = vpsubd_avx2(auVar86,auVar66);
  iVar61 = *(int *)((long)vert_filter_length_chroma + lVar58 + 400);
  auVar101._4_4_ = iVar61;
  auVar101._0_4_ = iVar61;
  auVar101._8_4_ = iVar61;
  auVar101._12_4_ = iVar61;
  auVar101._16_4_ = iVar61;
  auVar101._20_4_ = iVar61;
  auVar101._24_4_ = iVar61;
  auVar101._28_4_ = iVar61;
  iVar63 = *(int *)((long)vert_filter_length_chroma + lVar58 + 0x230);
  auVar137._4_4_ = iVar63;
  auVar137._0_4_ = iVar63;
  auVar137._8_4_ = iVar63;
  auVar137._12_4_ = iVar63;
  auVar137._16_4_ = iVar63;
  auVar137._20_4_ = iVar63;
  auVar137._24_4_ = iVar63;
  auVar137._28_4_ = iVar63;
  auVar86 = vpmulld_avx2(auVar101,auVar4);
  auVar86 = vpaddd_avx2(auVar86,auVar83);
  auVar66 = vpmulld_avx2(auVar137,auVar5);
  auVar86 = vpaddd_avx2(auVar86,auVar66);
  auVar66 = vpmulld_avx2(auVar4,auVar137);
  auVar4 = vpmulld_avx2(auVar101,auVar5);
  auVar4 = vpaddd_avx2(auVar4,auVar83);
  auVar100 = vpsubd_avx2(auVar4,auVar66);
  auVar5 = vpsrad_avx2(auVar68,auVar65);
  auVar4 = vpaddd_avx2(auVar10,auVar5);
  auVar92 = vpsubd_avx2(auVar10,auVar5);
  auVar5 = vpsrad_avx2(auVar6,auVar65);
  auVar93 = vpsubd_avx2(auVar96,auVar5);
  auVar5 = vpaddd_avx2(auVar96,auVar5);
  auVar10 = vpsrad_avx2(auVar17,auVar65);
  auVar6 = vpaddd_avx2(auVar10,auVar88);
  auVar96 = vpsubd_avx2(auVar88,auVar10);
  auVar10 = vpsrad_avx2(auVar71,auVar65);
  auVar70 = vpsubd_avx2(auVar9,auVar10);
  auVar9 = vpaddd_avx2(auVar10,auVar9);
  auVar17 = vpsrad_avx2(auVar97,auVar65);
  auVar10 = vpaddd_avx2(auVar17,auVar95);
  auVar97 = vpsubd_avx2(auVar95,auVar17);
  auVar17 = vpsrad_avx2(auVar48,auVar65);
  auVar48 = vpsubd_avx2(auVar49,auVar17);
  auVar17 = vpaddd_avx2(auVar17,auVar49);
  auVar68 = vpsrad_avx2(auVar69,auVar65);
  auVar95 = vpaddd_avx2(auVar68,auVar121);
  auVar69 = vpsubd_avx2(auVar121,auVar68);
  auVar68 = vpsrad_avx2(auVar50,auVar65);
  auVar49 = vpsubd_avx2(auVar12,auVar68);
  auVar12 = vpaddd_avx2(auVar12,auVar68);
  iVar56 = -iVar56;
  auVar144._4_4_ = iVar56;
  auVar144._0_4_ = iVar56;
  auVar144._8_4_ = iVar56;
  auVar144._12_4_ = iVar56;
  auVar144._16_4_ = iVar56;
  auVar144._20_4_ = iVar56;
  auVar144._24_4_ = iVar56;
  auVar144._28_4_ = iVar56;
  auVar68 = vpmulld_avx2(auVar120,auVar25);
  auVar68 = vpaddd_avx2(auVar68,auVar83);
  auVar71 = vpmulld_avx2(auVar144,auVar14);
  auVar68 = vpaddd_avx2(auVar68,auVar71);
  auVar14 = vpmulld_avx2(auVar120,auVar14);
  auVar25 = vpmulld_avx2(auVar25,auVar144);
  auVar14 = vpaddd_avx2(auVar14,auVar83);
  auVar50 = vpsubd_avx2(auVar14,auVar25);
  iVar59 = -iVar59;
  auVar121._4_4_ = iVar59;
  auVar121._0_4_ = iVar59;
  auVar121._8_4_ = iVar59;
  auVar121._12_4_ = iVar59;
  auVar121._16_4_ = iVar59;
  auVar121._20_4_ = iVar59;
  auVar121._24_4_ = iVar59;
  auVar121._28_4_ = iVar59;
  auVar14 = vpmulld_avx2(auVar121,auVar122);
  auVar14 = vpaddd_avx2(auVar14,auVar83);
  auVar25 = vpmulld_avx2(auVar144,auVar82);
  auVar14 = vpaddd_avx2(auVar14,auVar25);
  auVar25 = vpmulld_avx2(auVar144,auVar122);
  auVar71 = vpmulld_avx2(auVar82,auVar121);
  auVar71 = vpsubd_avx2(auVar83,auVar71);
  auVar25 = vpaddd_avx2(auVar25,auVar71);
  iVar64 = -iVar64;
  auVar122._4_4_ = iVar64;
  auVar122._0_4_ = iVar64;
  auVar122._8_4_ = iVar64;
  auVar122._12_4_ = iVar64;
  auVar122._16_4_ = iVar64;
  auVar122._20_4_ = iVar64;
  auVar122._24_4_ = iVar64;
  auVar122._28_4_ = iVar64;
  auVar71 = vpmulld_avx2(auVar141,auVar81);
  auVar71 = vpaddd_avx2(auVar71,auVar83);
  auVar66 = vpmulld_avx2(auVar122,auVar77);
  auVar71 = vpaddd_avx2(auVar71,auVar66);
  auVar66 = vpmulld_avx2(auVar141,auVar77);
  auVar81 = vpmulld_avx2(auVar81,auVar122);
  auVar66 = vpaddd_avx2(auVar66,auVar83);
  auVar121 = vpsubd_avx2(auVar66,auVar81);
  iVar60 = -iVar60;
  auVar138._4_4_ = iVar60;
  auVar138._0_4_ = iVar60;
  auVar138._8_4_ = iVar60;
  auVar138._12_4_ = iVar60;
  auVar138._16_4_ = iVar60;
  auVar138._20_4_ = iVar60;
  auVar138._24_4_ = iVar60;
  auVar138._28_4_ = iVar60;
  auVar66 = vpmulld_avx2(auVar138,auVar15);
  auVar66 = vpaddd_avx2(auVar66,auVar83);
  auVar81 = vpmulld_avx2(auVar122,auVar28);
  auVar66 = vpaddd_avx2(auVar66,auVar81);
  auVar15 = vpmulld_avx2(auVar122,auVar15);
  auVar28 = vpmulld_avx2(auVar28,auVar138);
  auVar28 = vpsubd_avx2(auVar83,auVar28);
  auVar15 = vpaddd_avx2(auVar28,auVar15);
  iVar57 = -iVar57;
  auVar123._4_4_ = iVar57;
  auVar123._0_4_ = iVar57;
  auVar123._8_4_ = iVar57;
  auVar123._12_4_ = iVar57;
  auVar123._16_4_ = iVar57;
  auVar123._20_4_ = iVar57;
  auVar123._24_4_ = iVar57;
  auVar123._28_4_ = iVar57;
  auVar28 = vpmulld_avx2(auVar87,auVar80);
  auVar28 = vpaddd_avx2(auVar28,auVar83);
  auVar81 = vpmulld_avx2(auVar123,auVar26);
  auVar28 = vpaddd_avx2(auVar28,auVar81);
  auVar26 = vpmulld_avx2(auVar87,auVar26);
  auVar80 = vpmulld_avx2(auVar80,auVar123);
  auVar26 = vpaddd_avx2(auVar26,auVar83);
  auVar122 = vpsubd_avx2(auVar26,auVar80);
  iVar62 = -iVar62;
  auVar88._4_4_ = iVar62;
  auVar88._0_4_ = iVar62;
  auVar88._8_4_ = iVar62;
  auVar88._12_4_ = iVar62;
  auVar88._16_4_ = iVar62;
  auVar88._20_4_ = iVar62;
  auVar88._24_4_ = iVar62;
  auVar88._28_4_ = iVar62;
  auVar26 = vpmulld_avx2(auVar88,auVar52);
  auVar26 = vpaddd_avx2(auVar26,auVar83);
  auVar80 = vpmulld_avx2(auVar123,auVar91);
  auVar26 = vpaddd_avx2(auVar26,auVar80);
  auVar80 = vpmulld_avx2(auVar123,auVar52);
  auVar81 = vpmulld_avx2(auVar91,auVar88);
  auVar81 = vpsubd_avx2(auVar83,auVar81);
  auVar80 = vpaddd_avx2(auVar81,auVar80);
  iVar63 = -iVar63;
  auVar89._4_4_ = iVar63;
  auVar89._0_4_ = iVar63;
  auVar89._8_4_ = iVar63;
  auVar89._12_4_ = iVar63;
  auVar89._16_4_ = iVar63;
  auVar89._20_4_ = iVar63;
  auVar89._24_4_ = iVar63;
  auVar89._28_4_ = iVar63;
  auVar81 = vpmulld_avx2(auVar101,auVar78);
  auVar81 = vpaddd_avx2(auVar81,auVar83);
  auVar82 = vpmulld_avx2(auVar89,auVar79);
  auVar81 = vpaddd_avx2(auVar82,auVar81);
  auVar82 = vpmulld_avx2(auVar101,auVar79);
  auVar91 = vpmulld_avx2(auVar78,auVar89);
  auVar82 = vpaddd_avx2(auVar82,auVar83);
  auVar52 = vpsubd_avx2(auVar82,auVar91);
  iVar61 = -iVar61;
  auVar102._4_4_ = iVar61;
  auVar102._0_4_ = iVar61;
  auVar102._8_4_ = iVar61;
  auVar102._12_4_ = iVar61;
  auVar102._16_4_ = iVar61;
  auVar102._20_4_ = iVar61;
  auVar102._24_4_ = iVar61;
  auVar102._28_4_ = iVar61;
  auVar82 = vpmulld_avx2(auVar102,auVar18);
  auVar82 = vpaddd_avx2(auVar82,auVar83);
  auVar91 = vpmulld_avx2(auVar89,auVar22);
  auVar82 = vpaddd_avx2(auVar91,auVar82);
  auVar18 = vpmulld_avx2(auVar89,auVar18);
  auVar22 = vpmulld_avx2(auVar22,auVar102);
  auVar22 = vpsubd_avx2(auVar83,auVar22);
  auVar18 = vpaddd_avx2(auVar22,auVar18);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 600);
  auVar90._4_4_ = uVar2;
  auVar90._0_4_ = uVar2;
  auVar90._8_4_ = uVar2;
  auVar90._12_4_ = uVar2;
  auVar90._16_4_ = uVar2;
  auVar90._20_4_ = uVar2;
  auVar90._24_4_ = uVar2;
  auVar90._28_4_ = uVar2;
  auVar22 = vpmulld_avx2(auVar90,auVar4);
  auVar22 = vpaddd_avx2(auVar22,auVar83);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x168);
  auVar124._4_4_ = uVar2;
  auVar124._0_4_ = uVar2;
  auVar124._8_4_ = uVar2;
  auVar124._12_4_ = uVar2;
  auVar124._16_4_ = uVar2;
  auVar124._20_4_ = uVar2;
  auVar124._24_4_ = uVar2;
  auVar124._28_4_ = uVar2;
  auVar91 = vpmulld_avx2(auVar124,auVar12);
  auVar22 = vpaddd_avx2(auVar91,auVar22);
  auVar12 = vpmulld_avx2(auVar90,auVar12);
  auVar91 = vpmulld_avx2(auVar4,auVar124);
  auVar4 = vpaddd_avx2(auVar12,auVar83);
  auVar87 = vpsubd_avx2(auVar4,auVar91);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1d8);
  auVar91._4_4_ = uVar2;
  auVar91._0_4_ = uVar2;
  auVar91._8_4_ = uVar2;
  auVar91._12_4_ = uVar2;
  auVar91._16_4_ = uVar2;
  auVar91._20_4_ = uVar2;
  auVar91._24_4_ = uVar2;
  auVar91._28_4_ = uVar2;
  auVar4 = vpmulld_avx2(auVar91,auVar92);
  auVar4 = vpaddd_avx2(auVar4,auVar83);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1e8);
  auVar125._4_4_ = uVar2;
  auVar125._0_4_ = uVar2;
  auVar125._8_4_ = uVar2;
  auVar125._12_4_ = uVar2;
  auVar125._16_4_ = uVar2;
  auVar125._20_4_ = uVar2;
  auVar125._24_4_ = uVar2;
  auVar125._28_4_ = uVar2;
  auVar12 = vpmulld_avx2(auVar125,auVar49);
  auVar4 = vpaddd_avx2(auVar4,auVar12);
  auVar12 = vpmulld_avx2(auVar91,auVar49);
  auVar91 = vpmulld_avx2(auVar92,auVar125);
  auVar12 = vpaddd_avx2(auVar12,auVar83);
  auVar49 = vpsubd_avx2(auVar12,auVar91);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x218);
  auVar92._4_4_ = uVar2;
  auVar92._0_4_ = uVar2;
  auVar92._8_4_ = uVar2;
  auVar92._12_4_ = uVar2;
  auVar92._16_4_ = uVar2;
  auVar92._20_4_ = uVar2;
  auVar92._24_4_ = uVar2;
  auVar92._28_4_ = uVar2;
  auVar12 = vpmulld_avx2(auVar92,auVar93);
  auVar12 = vpaddd_avx2(auVar12,auVar83);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1a8);
  auVar126._4_4_ = uVar2;
  auVar126._0_4_ = uVar2;
  auVar126._8_4_ = uVar2;
  auVar126._12_4_ = uVar2;
  auVar126._16_4_ = uVar2;
  auVar126._20_4_ = uVar2;
  auVar126._24_4_ = uVar2;
  auVar126._28_4_ = uVar2;
  auVar91 = vpmulld_avx2(auVar126,auVar69);
  auVar12 = vpaddd_avx2(auVar12,auVar91);
  auVar91 = vpmulld_avx2(auVar92,auVar69);
  auVar69 = vpmulld_avx2(auVar93,auVar126);
  auVar91 = vpaddd_avx2(auVar91,auVar83);
  auVar92 = vpsubd_avx2(auVar91,auVar69);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x198);
  auVar93._4_4_ = uVar2;
  auVar93._0_4_ = uVar2;
  auVar93._8_4_ = uVar2;
  auVar93._12_4_ = uVar2;
  auVar93._16_4_ = uVar2;
  auVar93._20_4_ = uVar2;
  auVar93._24_4_ = uVar2;
  auVar93._28_4_ = uVar2;
  auVar91 = vpmulld_avx2(auVar93,auVar5);
  auVar91 = vpaddd_avx2(auVar91,auVar83);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x228);
  auVar127._4_4_ = uVar2;
  auVar127._0_4_ = uVar2;
  auVar127._8_4_ = uVar2;
  auVar127._12_4_ = uVar2;
  auVar127._16_4_ = uVar2;
  auVar127._20_4_ = uVar2;
  auVar127._24_4_ = uVar2;
  auVar127._28_4_ = uVar2;
  auVar69 = vpmulld_avx2(auVar127,auVar95);
  auVar91 = vpaddd_avx2(auVar91,auVar69);
  auVar95 = vpmulld_avx2(auVar93,auVar95);
  auVar69 = vpmulld_avx2(auVar5,auVar127);
  auVar5 = vpaddd_avx2(auVar95,auVar83);
  auVar93 = vpsubd_avx2(auVar5,auVar69);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x238);
  auVar94._4_4_ = uVar2;
  auVar94._0_4_ = uVar2;
  auVar94._8_4_ = uVar2;
  auVar94._12_4_ = uVar2;
  auVar94._16_4_ = uVar2;
  auVar94._20_4_ = uVar2;
  auVar94._24_4_ = uVar2;
  auVar94._28_4_ = uVar2;
  auVar5 = vpmulld_avx2(auVar94,auVar6);
  auVar5 = vpaddd_avx2(auVar5,auVar83);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x188);
  auVar128._4_4_ = uVar2;
  auVar128._0_4_ = uVar2;
  auVar128._8_4_ = uVar2;
  auVar128._12_4_ = uVar2;
  auVar128._16_4_ = uVar2;
  auVar128._20_4_ = uVar2;
  auVar128._24_4_ = uVar2;
  auVar128._28_4_ = uVar2;
  auVar95 = vpmulld_avx2(auVar128,auVar17);
  auVar5 = vpaddd_avx2(auVar5,auVar95);
  auVar17 = vpmulld_avx2(auVar94,auVar17);
  auVar95 = vpmulld_avx2(auVar6,auVar128);
  auVar6 = vpaddd_avx2(auVar17,auVar83);
  auVar88 = vpsubd_avx2(auVar6,auVar95);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1b8);
  auVar95._4_4_ = uVar2;
  auVar95._0_4_ = uVar2;
  auVar95._8_4_ = uVar2;
  auVar95._12_4_ = uVar2;
  auVar95._16_4_ = uVar2;
  auVar95._20_4_ = uVar2;
  auVar95._24_4_ = uVar2;
  auVar95._28_4_ = uVar2;
  auVar6 = vpmulld_avx2(auVar95,auVar96);
  auVar6 = vpaddd_avx2(auVar6,auVar83);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x208);
  auVar129._4_4_ = uVar2;
  auVar129._0_4_ = uVar2;
  auVar129._8_4_ = uVar2;
  auVar129._12_4_ = uVar2;
  auVar129._16_4_ = uVar2;
  auVar129._20_4_ = uVar2;
  auVar129._24_4_ = uVar2;
  auVar129._28_4_ = uVar2;
  auVar17 = vpmulld_avx2(auVar129,auVar48);
  auVar6 = vpaddd_avx2(auVar6,auVar17);
  auVar17 = vpmulld_avx2(auVar95,auVar48);
  auVar95 = vpmulld_avx2(auVar96,auVar129);
  auVar17 = vpaddd_avx2(auVar17,auVar83);
  auVar48 = vpsubd_avx2(auVar17,auVar95);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1f8);
  auVar96._4_4_ = uVar2;
  auVar96._0_4_ = uVar2;
  auVar96._8_4_ = uVar2;
  auVar96._12_4_ = uVar2;
  auVar96._16_4_ = uVar2;
  auVar96._20_4_ = uVar2;
  auVar96._24_4_ = uVar2;
  auVar96._28_4_ = uVar2;
  auVar17 = vpmulld_avx2(auVar96,auVar70);
  auVar17 = vpaddd_avx2(auVar17,auVar83);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1c8);
  auVar130._4_4_ = uVar2;
  auVar130._0_4_ = uVar2;
  auVar130._8_4_ = uVar2;
  auVar130._12_4_ = uVar2;
  auVar130._16_4_ = uVar2;
  auVar130._20_4_ = uVar2;
  auVar130._24_4_ = uVar2;
  auVar130._28_4_ = uVar2;
  auVar95 = vpmulld_avx2(auVar130,auVar97);
  auVar17 = vpaddd_avx2(auVar17,auVar95);
  auVar95 = vpmulld_avx2(auVar96,auVar97);
  auVar69 = vpmulld_avx2(auVar70,auVar130);
  auVar95 = vpaddd_avx2(auVar95,auVar83);
  auVar96 = vpsubd_avx2(auVar95,auVar69);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x178);
  auVar97._4_4_ = uVar2;
  auVar97._0_4_ = uVar2;
  auVar97._8_4_ = uVar2;
  auVar97._12_4_ = uVar2;
  auVar97._16_4_ = uVar2;
  auVar97._20_4_ = uVar2;
  auVar97._24_4_ = uVar2;
  auVar97._28_4_ = uVar2;
  auVar95 = vpmulld_avx2(auVar97,auVar9);
  auVar95 = vpaddd_avx2(auVar95,auVar83);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x248);
  auVar131._4_4_ = uVar2;
  auVar131._0_4_ = uVar2;
  auVar131._8_4_ = uVar2;
  auVar131._12_4_ = uVar2;
  auVar131._16_4_ = uVar2;
  auVar131._20_4_ = uVar2;
  auVar131._24_4_ = uVar2;
  auVar131._28_4_ = uVar2;
  auVar69 = vpmulld_avx2(auVar131,auVar10);
  auVar95 = vpaddd_avx2(auVar95,auVar69);
  auVar10 = vpmulld_avx2(auVar97,auVar10);
  auVar69 = vpmulld_avx2(auVar9,auVar131);
  auVar9 = vpaddd_avx2(auVar10,auVar83);
  auVar97 = vpsubd_avx2(auVar9,auVar69);
  auVar10 = vpsrad_avx2(auVar68,auVar65);
  auVar9 = vpaddd_avx2(auVar10,auVar11);
  auVar69 = vpsubd_avx2(auVar11,auVar10);
  auVar10 = vpsrad_avx2(auVar14,auVar65);
  auVar70 = vpsubd_avx2(auVar73,auVar10);
  auVar10 = vpaddd_avx2(auVar10,auVar73);
  auVar14 = vpsrad_avx2(auVar71,auVar65);
  auVar11 = vpaddd_avx2(auVar14,auVar85);
  auVar73 = vpsubd_avx2(auVar85,auVar14);
  auVar14 = vpsrad_avx2(auVar66,auVar65);
  auVar66 = vpsubd_avx2(auVar13,auVar14);
  auVar13 = vpaddd_avx2(auVar14,auVar13);
  auVar28 = vpsrad_avx2(auVar28,auVar65);
  auVar14 = vpaddd_avx2(auVar28,auVar20);
  auVar77 = vpsubd_avx2(auVar20,auVar28);
  auVar20 = vpsrad_avx2(auVar26,auVar65);
  auVar78 = vpsubd_avx2(auVar54,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar54);
  auVar28 = vpsrad_avx2(auVar81,auVar65);
  auVar26 = vpaddd_avx2(auVar28,auVar75);
  auVar81 = vpsubd_avx2(auVar75,auVar28);
  auVar28 = vpsrad_avx2(auVar82,auVar65);
  auVar82 = vpsubd_avx2(auVar16,auVar28);
  auVar16 = vpaddd_avx2(auVar28,auVar16);
  auVar28 = vpsrad_avx2(auVar18,auVar65);
  auVar18 = vpaddd_avx2(auVar28,auVar21);
  auVar54 = vpsubd_avx2(auVar21,auVar28);
  auVar21 = vpsrad_avx2(auVar52,auVar65);
  auVar52 = vpsubd_avx2(auVar74,auVar21);
  auVar21 = vpaddd_avx2(auVar21,auVar74);
  auVar28 = vpsrad_avx2(auVar80,auVar65);
  auVar80 = vpaddd_avx2(auVar28,auVar53);
  auVar53 = vpsubd_avx2(auVar53,auVar28);
  auVar28 = vpsrad_avx2(auVar122,auVar65);
  auVar122 = vpsubd_avx2(auVar76,auVar28);
  auVar76 = vpaddd_avx2(auVar28,auVar76);
  auVar28 = vpsrad_avx2(auVar15,auVar65);
  auVar15 = vpaddd_avx2(auVar28,auVar72);
  auVar74 = vpsubd_avx2(auVar72,auVar28);
  auVar72 = vpsrad_avx2(auVar121,auVar65);
  auVar121 = vpsubd_avx2(auVar98,auVar72);
  auVar72 = vpaddd_avx2(auVar72,auVar98);
  auVar28 = vpsrad_avx2(auVar25,auVar65);
  auVar25 = vpaddd_avx2(auVar28,auVar67);
  auVar71 = vpsubd_avx2(auVar67,auVar28);
  auVar28 = vpsrad_avx2(auVar50,auVar65);
  auVar50 = vpsubd_avx2(auVar23,auVar28);
  auVar23 = vpaddd_avx2(auVar28,auVar23);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x25c);
  auVar98._4_4_ = uVar2;
  auVar98._0_4_ = uVar2;
  auVar98._8_4_ = uVar2;
  auVar98._12_4_ = uVar2;
  auVar98._16_4_ = uVar2;
  auVar98._20_4_ = uVar2;
  auVar98._24_4_ = uVar2;
  auVar98._28_4_ = uVar2;
  auVar28 = vpmulld_avx2(auVar98,auVar9);
  auVar28 = vpaddd_avx2(auVar28,auVar83);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x164);
  auVar67._4_4_ = uVar2;
  auVar67._0_4_ = uVar2;
  auVar67._8_4_ = uVar2;
  auVar67._12_4_ = uVar2;
  auVar67._16_4_ = uVar2;
  auVar67._20_4_ = uVar2;
  auVar67._24_4_ = uVar2;
  auVar67._28_4_ = uVar2;
  auVar68 = vpmulld_avx2(auVar67,auVar23);
  auVar28 = vpaddd_avx2(auVar28,auVar68);
  auVar23 = vpmulld_avx2(auVar98,auVar23);
  auVar68 = vpmulld_avx2(auVar9,auVar67);
  auVar9 = vpaddd_avx2(auVar23,auVar83);
  auVar67 = vpsubd_avx2(auVar9,auVar68);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1dc);
  auVar68._4_4_ = uVar2;
  auVar68._0_4_ = uVar2;
  auVar68._8_4_ = uVar2;
  auVar68._12_4_ = uVar2;
  auVar68._16_4_ = uVar2;
  auVar68._20_4_ = uVar2;
  auVar68._24_4_ = uVar2;
  auVar68._28_4_ = uVar2;
  auVar9 = vpmulld_avx2(auVar68,auVar69);
  auVar9 = vpaddd_avx2(auVar9,auVar83);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1e4);
  auVar103._4_4_ = uVar2;
  auVar103._0_4_ = uVar2;
  auVar103._8_4_ = uVar2;
  auVar103._12_4_ = uVar2;
  auVar103._16_4_ = uVar2;
  auVar103._20_4_ = uVar2;
  auVar103._24_4_ = uVar2;
  auVar103._28_4_ = uVar2;
  auVar23 = vpmulld_avx2(auVar103,auVar50);
  auVar9 = vpaddd_avx2(auVar23,auVar9);
  auVar23 = vpmulld_avx2(auVar68,auVar50);
  auVar68 = vpmulld_avx2(auVar69,auVar103);
  auVar23 = vpaddd_avx2(auVar23,auVar83);
  auVar50 = vpsubd_avx2(auVar23,auVar68);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x21c);
  auVar69._4_4_ = uVar2;
  auVar69._0_4_ = uVar2;
  auVar69._8_4_ = uVar2;
  auVar69._12_4_ = uVar2;
  auVar69._16_4_ = uVar2;
  auVar69._20_4_ = uVar2;
  auVar69._24_4_ = uVar2;
  auVar69._28_4_ = uVar2;
  auVar23 = vpmulld_avx2(auVar69,auVar70);
  auVar23 = vpaddd_avx2(auVar23,auVar83);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1a4);
  auVar104._4_4_ = uVar2;
  auVar104._0_4_ = uVar2;
  auVar104._8_4_ = uVar2;
  auVar104._12_4_ = uVar2;
  auVar104._16_4_ = uVar2;
  auVar104._20_4_ = uVar2;
  auVar104._24_4_ = uVar2;
  auVar104._28_4_ = uVar2;
  auVar68 = vpmulld_avx2(auVar104,auVar71);
  auVar23 = vpaddd_avx2(auVar23,auVar68);
  auVar68 = vpmulld_avx2(auVar69,auVar71);
  auVar71 = vpmulld_avx2(auVar70,auVar104);
  auVar68 = vpaddd_avx2(auVar68,auVar83);
  auVar98 = vpsubd_avx2(auVar68,auVar71);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x19c);
  auVar70._4_4_ = uVar2;
  auVar70._0_4_ = uVar2;
  auVar70._8_4_ = uVar2;
  auVar70._12_4_ = uVar2;
  auVar70._16_4_ = uVar2;
  auVar70._20_4_ = uVar2;
  auVar70._24_4_ = uVar2;
  auVar70._28_4_ = uVar2;
  auVar68 = vpmulld_avx2(auVar70,auVar10);
  auVar68 = vpaddd_avx2(auVar68,auVar83);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x224);
  auVar105._4_4_ = uVar2;
  auVar105._0_4_ = uVar2;
  auVar105._8_4_ = uVar2;
  auVar105._12_4_ = uVar2;
  auVar105._16_4_ = uVar2;
  auVar105._20_4_ = uVar2;
  auVar105._24_4_ = uVar2;
  auVar105._28_4_ = uVar2;
  auVar71 = vpmulld_avx2(auVar105,auVar25);
  auVar68 = vpaddd_avx2(auVar68,auVar71);
  auVar25 = vpmulld_avx2(auVar70,auVar25);
  auVar71 = vpmulld_avx2(auVar10,auVar105);
  auVar10 = vpaddd_avx2(auVar25,auVar83);
  auVar70 = vpsubd_avx2(auVar10,auVar71);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x23c);
  auVar71._4_4_ = uVar2;
  auVar71._0_4_ = uVar2;
  auVar71._8_4_ = uVar2;
  auVar71._12_4_ = uVar2;
  auVar71._16_4_ = uVar2;
  auVar71._20_4_ = uVar2;
  auVar71._24_4_ = uVar2;
  auVar71._28_4_ = uVar2;
  auVar10 = vpmulld_avx2(auVar71,auVar11);
  auVar10 = vpaddd_avx2(auVar10,auVar83);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x184);
  auVar106._4_4_ = uVar2;
  auVar106._0_4_ = uVar2;
  auVar106._8_4_ = uVar2;
  auVar106._12_4_ = uVar2;
  auVar106._16_4_ = uVar2;
  auVar106._20_4_ = uVar2;
  auVar106._24_4_ = uVar2;
  auVar106._28_4_ = uVar2;
  auVar25 = vpmulld_avx2(auVar106,auVar72);
  auVar10 = vpaddd_avx2(auVar10,auVar25);
  auVar25 = vpmulld_avx2(auVar71,auVar72);
  auVar72 = vpmulld_avx2(auVar11,auVar106);
  auVar11 = vpaddd_avx2(auVar25,auVar83);
  auVar85 = vpsubd_avx2(auVar11,auVar72);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1bc);
  auVar72._4_4_ = uVar2;
  auVar72._0_4_ = uVar2;
  auVar72._8_4_ = uVar2;
  auVar72._12_4_ = uVar2;
  auVar72._16_4_ = uVar2;
  auVar72._20_4_ = uVar2;
  auVar72._24_4_ = uVar2;
  auVar72._28_4_ = uVar2;
  auVar11 = vpmulld_avx2(auVar72,auVar73);
  auVar11 = vpaddd_avx2(auVar11,auVar83);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x204);
  auVar107._4_4_ = uVar2;
  auVar107._0_4_ = uVar2;
  auVar107._8_4_ = uVar2;
  auVar107._12_4_ = uVar2;
  auVar107._16_4_ = uVar2;
  auVar107._20_4_ = uVar2;
  auVar107._24_4_ = uVar2;
  auVar107._28_4_ = uVar2;
  auVar25 = vpmulld_avx2(auVar107,auVar121);
  auVar11 = vpaddd_avx2(auVar11,auVar25);
  auVar25 = vpmulld_avx2(auVar72,auVar121);
  auVar72 = vpmulld_avx2(auVar73,auVar107);
  auVar25 = vpaddd_avx2(auVar25,auVar83);
  auVar121 = vpsubd_avx2(auVar25,auVar72);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1fc);
  auVar73._4_4_ = uVar2;
  auVar73._0_4_ = uVar2;
  auVar73._8_4_ = uVar2;
  auVar73._12_4_ = uVar2;
  auVar73._16_4_ = uVar2;
  auVar73._20_4_ = uVar2;
  auVar73._24_4_ = uVar2;
  auVar73._28_4_ = uVar2;
  auVar25 = vpmulld_avx2(auVar73,auVar66);
  auVar25 = vpaddd_avx2(auVar25,auVar83);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1c4);
  auVar108._4_4_ = uVar2;
  auVar108._0_4_ = uVar2;
  auVar108._8_4_ = uVar2;
  auVar108._12_4_ = uVar2;
  auVar108._16_4_ = uVar2;
  auVar108._20_4_ = uVar2;
  auVar108._24_4_ = uVar2;
  auVar108._28_4_ = uVar2;
  auVar72 = vpmulld_avx2(auVar108,auVar74);
  auVar25 = vpaddd_avx2(auVar25,auVar72);
  auVar72 = vpmulld_avx2(auVar73,auVar74);
  auVar71 = vpmulld_avx2(auVar66,auVar108);
  auVar72 = vpaddd_avx2(auVar72,auVar83);
  auVar73 = vpsubd_avx2(auVar72,auVar71);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x17c);
  auVar74._4_4_ = uVar2;
  auVar74._0_4_ = uVar2;
  auVar74._8_4_ = uVar2;
  auVar74._12_4_ = uVar2;
  auVar74._16_4_ = uVar2;
  auVar74._20_4_ = uVar2;
  auVar74._24_4_ = uVar2;
  auVar74._28_4_ = uVar2;
  auVar72 = vpmulld_avx2(auVar74,auVar13);
  auVar72 = vpaddd_avx2(auVar72,auVar83);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x244);
  auVar109._4_4_ = uVar2;
  auVar109._0_4_ = uVar2;
  auVar109._8_4_ = uVar2;
  auVar109._12_4_ = uVar2;
  auVar109._16_4_ = uVar2;
  auVar109._20_4_ = uVar2;
  auVar109._24_4_ = uVar2;
  auVar109._28_4_ = uVar2;
  auVar71 = vpmulld_avx2(auVar109,auVar15);
  auVar72 = vpaddd_avx2(auVar72,auVar71);
  auVar15 = vpmulld_avx2(auVar74,auVar15);
  auVar71 = vpmulld_avx2(auVar13,auVar109);
  auVar13 = vpaddd_avx2(auVar15,auVar83);
  auVar74 = vpsubd_avx2(auVar13,auVar71);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x24c);
  auVar75._4_4_ = uVar2;
  auVar75._0_4_ = uVar2;
  auVar75._8_4_ = uVar2;
  auVar75._12_4_ = uVar2;
  auVar75._16_4_ = uVar2;
  auVar75._20_4_ = uVar2;
  auVar75._24_4_ = uVar2;
  auVar75._28_4_ = uVar2;
  auVar13 = vpmulld_avx2(auVar75,auVar14);
  auVar13 = vpaddd_avx2(auVar13,auVar83);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x174);
  auVar110._4_4_ = uVar2;
  auVar110._0_4_ = uVar2;
  auVar110._8_4_ = uVar2;
  auVar110._12_4_ = uVar2;
  auVar110._16_4_ = uVar2;
  auVar110._20_4_ = uVar2;
  auVar110._24_4_ = uVar2;
  auVar110._28_4_ = uVar2;
  auVar15 = vpmulld_avx2(auVar110,auVar76);
  auVar13 = vpaddd_avx2(auVar13,auVar15);
  auVar15 = vpmulld_avx2(auVar75,auVar76);
  auVar76 = vpmulld_avx2(auVar14,auVar110);
  auVar14 = vpaddd_avx2(auVar15,auVar83);
  auVar75 = vpsubd_avx2(auVar14,auVar76);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1cc);
  auVar76._4_4_ = uVar2;
  auVar76._0_4_ = uVar2;
  auVar76._8_4_ = uVar2;
  auVar76._12_4_ = uVar2;
  auVar76._16_4_ = uVar2;
  auVar76._20_4_ = uVar2;
  auVar76._24_4_ = uVar2;
  auVar76._28_4_ = uVar2;
  auVar14 = vpmulld_avx2(auVar76,auVar77);
  auVar14 = vpaddd_avx2(auVar14,auVar83);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 500);
  auVar111._4_4_ = uVar2;
  auVar111._0_4_ = uVar2;
  auVar111._8_4_ = uVar2;
  auVar111._12_4_ = uVar2;
  auVar111._16_4_ = uVar2;
  auVar111._20_4_ = uVar2;
  auVar111._24_4_ = uVar2;
  auVar111._28_4_ = uVar2;
  auVar15 = vpmulld_avx2(auVar111,auVar122);
  auVar14 = vpaddd_avx2(auVar14,auVar15);
  auVar15 = vpmulld_avx2(auVar76,auVar122);
  auVar76 = vpmulld_avx2(auVar77,auVar111);
  auVar15 = vpaddd_avx2(auVar15,auVar83);
  auVar122 = vpsubd_avx2(auVar15,auVar76);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x20c);
  auVar77._4_4_ = uVar2;
  auVar77._0_4_ = uVar2;
  auVar77._8_4_ = uVar2;
  auVar77._12_4_ = uVar2;
  auVar77._16_4_ = uVar2;
  auVar77._20_4_ = uVar2;
  auVar77._24_4_ = uVar2;
  auVar77._28_4_ = uVar2;
  auVar15 = vpmulld_avx2(auVar77,auVar78);
  auVar15 = vpaddd_avx2(auVar15,auVar83);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1b4);
  auVar112._4_4_ = uVar2;
  auVar112._0_4_ = uVar2;
  auVar112._8_4_ = uVar2;
  auVar112._12_4_ = uVar2;
  auVar112._16_4_ = uVar2;
  auVar112._20_4_ = uVar2;
  auVar112._24_4_ = uVar2;
  auVar112._28_4_ = uVar2;
  auVar76 = vpmulld_avx2(auVar112,auVar53);
  auVar15 = vpaddd_avx2(auVar15,auVar76);
  auVar76 = vpmulld_avx2(auVar77,auVar53);
  auVar71 = vpmulld_avx2(auVar78,auVar112);
  auVar76 = vpaddd_avx2(auVar76,auVar83);
  auVar53 = vpsubd_avx2(auVar76,auVar71);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x18c);
  auVar78._4_4_ = uVar2;
  auVar78._0_4_ = uVar2;
  auVar78._8_4_ = uVar2;
  auVar78._12_4_ = uVar2;
  auVar78._16_4_ = uVar2;
  auVar78._20_4_ = uVar2;
  auVar78._24_4_ = uVar2;
  auVar78._28_4_ = uVar2;
  auVar76 = vpmulld_avx2(auVar78,auVar20);
  auVar76 = vpaddd_avx2(auVar76,auVar83);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x234);
  auVar113._4_4_ = uVar2;
  auVar113._0_4_ = uVar2;
  auVar113._8_4_ = uVar2;
  auVar113._12_4_ = uVar2;
  auVar113._16_4_ = uVar2;
  auVar113._20_4_ = uVar2;
  auVar113._24_4_ = uVar2;
  auVar113._28_4_ = uVar2;
  auVar71 = vpmulld_avx2(auVar113,auVar80);
  auVar76 = vpaddd_avx2(auVar76,auVar71);
  auVar80 = vpmulld_avx2(auVar78,auVar80);
  auVar71 = vpmulld_avx2(auVar20,auVar113);
  auVar20 = vpaddd_avx2(auVar80,auVar83);
  auVar77 = vpsubd_avx2(auVar20,auVar71);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x22c);
  auVar79._4_4_ = uVar2;
  auVar79._0_4_ = uVar2;
  auVar79._8_4_ = uVar2;
  auVar79._12_4_ = uVar2;
  auVar79._16_4_ = uVar2;
  auVar79._20_4_ = uVar2;
  auVar79._24_4_ = uVar2;
  auVar79._28_4_ = uVar2;
  auVar20 = vpmulld_avx2(auVar79,auVar26);
  auVar20 = vpaddd_avx2(auVar20,auVar83);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x194);
  auVar114._4_4_ = uVar2;
  auVar114._0_4_ = uVar2;
  auVar114._8_4_ = uVar2;
  auVar114._12_4_ = uVar2;
  auVar114._16_4_ = uVar2;
  auVar114._20_4_ = uVar2;
  auVar114._24_4_ = uVar2;
  auVar114._28_4_ = uVar2;
  auVar80 = vpmulld_avx2(auVar114,auVar21);
  auVar20 = vpaddd_avx2(auVar20,auVar80);
  auVar21 = vpmulld_avx2(auVar79,auVar21);
  auVar26 = vpmulld_avx2(auVar26,auVar114);
  auVar21 = vpaddd_avx2(auVar21,auVar83);
  auVar78 = vpsubd_avx2(auVar21,auVar26);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1ac);
  auVar80._4_4_ = uVar2;
  auVar80._0_4_ = uVar2;
  auVar80._8_4_ = uVar2;
  auVar80._12_4_ = uVar2;
  auVar80._16_4_ = uVar2;
  auVar80._20_4_ = uVar2;
  auVar80._24_4_ = uVar2;
  auVar80._28_4_ = uVar2;
  auVar21 = vpmulld_avx2(auVar80,auVar81);
  auVar21 = vpaddd_avx2(auVar21,auVar83);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x214);
  auVar115._4_4_ = uVar2;
  auVar115._0_4_ = uVar2;
  auVar115._8_4_ = uVar2;
  auVar115._12_4_ = uVar2;
  auVar115._16_4_ = uVar2;
  auVar115._20_4_ = uVar2;
  auVar115._24_4_ = uVar2;
  auVar115._28_4_ = uVar2;
  auVar26 = vpmulld_avx2(auVar115,auVar52);
  auVar21 = vpaddd_avx2(auVar21,auVar26);
  auVar26 = vpmulld_avx2(auVar80,auVar52);
  auVar80 = vpmulld_avx2(auVar81,auVar115);
  auVar26 = vpaddd_avx2(auVar26,auVar83);
  auVar52 = vpsubd_avx2(auVar26,auVar80);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1ec);
  auVar81._4_4_ = uVar2;
  auVar81._0_4_ = uVar2;
  auVar81._8_4_ = uVar2;
  auVar81._12_4_ = uVar2;
  auVar81._16_4_ = uVar2;
  auVar81._20_4_ = uVar2;
  auVar81._24_4_ = uVar2;
  auVar81._28_4_ = uVar2;
  auVar26 = vpmulld_avx2(auVar81,auVar82);
  auVar26 = vpaddd_avx2(auVar26,auVar83);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x1d4);
  auVar116._4_4_ = uVar2;
  auVar116._0_4_ = uVar2;
  auVar116._8_4_ = uVar2;
  auVar116._12_4_ = uVar2;
  auVar116._16_4_ = uVar2;
  auVar116._20_4_ = uVar2;
  auVar116._24_4_ = uVar2;
  auVar116._28_4_ = uVar2;
  auVar80 = vpmulld_avx2(auVar116,auVar54);
  auVar26 = vpaddd_avx2(auVar26,auVar80);
  auVar80 = vpmulld_avx2(auVar81,auVar54);
  auVar71 = vpmulld_avx2(auVar82,auVar116);
  auVar80 = vpaddd_avx2(auVar80,auVar83);
  auVar54 = vpsubd_avx2(auVar80,auVar71);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x16c);
  auVar82._4_4_ = uVar2;
  auVar82._0_4_ = uVar2;
  auVar82._8_4_ = uVar2;
  auVar82._12_4_ = uVar2;
  auVar82._16_4_ = uVar2;
  auVar82._20_4_ = uVar2;
  auVar82._24_4_ = uVar2;
  auVar82._28_4_ = uVar2;
  auVar80 = vpmulld_avx2(auVar82,auVar16);
  auVar80 = vpaddd_avx2(auVar80,auVar83);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar58 + 0x254);
  auVar117._4_4_ = uVar2;
  auVar117._0_4_ = uVar2;
  auVar117._8_4_ = uVar2;
  auVar117._12_4_ = uVar2;
  auVar117._16_4_ = uVar2;
  auVar117._20_4_ = uVar2;
  auVar117._24_4_ = uVar2;
  auVar117._28_4_ = uVar2;
  auVar71 = vpmulld_avx2(auVar117,auVar18);
  auVar80 = vpaddd_avx2(auVar80,auVar71);
  auVar71 = vpmulld_avx2(auVar82,auVar18);
  auVar66 = vpmulld_avx2(auVar16,auVar117);
  auVar16 = vpaddd_avx2(auVar83,auVar44);
  auVar18 = vpaddd_avx2(auVar83,auVar45);
  auVar71 = vpaddd_avx2(auVar71,auVar83);
  auVar79 = vpsubd_avx2(auVar71,auVar66);
  alVar29 = (__m256i)vpsrad_avx2(auVar16,auVar65);
  auVar16 = vpsrad_avx2(auVar18,auVar65);
  auVar3 = vpsrad_avx2(auVar3,auVar65);
  auVar18 = vpsrad_avx2(auVar27,auVar65);
  auVar19 = vpsrad_avx2(auVar19,auVar65);
  auVar7 = vpsrad_avx2(auVar7,auVar65);
  auVar24 = vpsrad_avx2(auVar24,auVar65);
  auVar27 = vpsrad_avx2(auVar135,auVar65);
  auVar135 = vpsrad_avx2(auVar43,auVar65);
  auVar43 = vpsrad_avx2(auVar51,auVar65);
  auVar8 = vpsrad_avx2(auVar8,auVar65);
  auVar71 = vpsrad_avx2(auVar47,auVar65);
  auVar84 = vpsrad_avx2(auVar84,auVar65);
  auVar66 = vpsrad_avx2(auVar46,auVar65);
  auVar86 = vpsrad_avx2(auVar86,auVar65);
  auVar81 = vpsrad_avx2(auVar100,auVar65);
  alVar30 = (__m256i)vpsrad_avx2(auVar22,auVar65);
  alVar31 = (__m256i)vpsrad_avx2(auVar87,auVar65);
  auVar4 = vpsrad_avx2(auVar4,auVar65);
  auVar22 = vpsrad_avx2(auVar49,auVar65);
  auVar12 = vpsrad_avx2(auVar12,auVar65);
  auVar82 = vpsrad_avx2(auVar92,auVar65);
  auVar91 = vpsrad_avx2(auVar91,auVar65);
  auVar44 = vpsrad_avx2(auVar93,auVar65);
  auVar5 = vpsrad_avx2(auVar5,auVar65);
  auVar45 = vpsrad_avx2(auVar88,auVar65);
  auVar6 = vpsrad_avx2(auVar6,auVar65);
  auVar69 = vpsrad_avx2(auVar48,auVar65);
  auVar65 = ZEXT416(uVar55);
  auVar17 = vpsrad_avx2(auVar17,auVar65);
  auVar46 = vpsrad_avx2(auVar96,auVar65);
  auVar95 = vpsrad_avx2(auVar95,auVar65);
  auVar47 = vpsrad_avx2(auVar97,auVar65);
  alVar32 = (__m256i)vpsrad_avx2(auVar28,auVar65);
  alVar33 = (__m256i)vpsrad_avx2(auVar67,auVar65);
  auVar9 = vpsrad_avx2(auVar9,auVar65);
  auVar28 = vpsrad_avx2(auVar50,auVar65);
  auVar23 = vpsrad_avx2(auVar23,auVar65);
  auVar48 = vpsrad_avx2(auVar98,auVar65);
  auVar68 = vpsrad_avx2(auVar68,auVar65);
  auVar49 = vpsrad_avx2(auVar70,auVar65);
  auVar10 = vpsrad_avx2(auVar10,auVar65);
  auVar96 = vpsrad_avx2(auVar85,auVar65);
  auVar11 = vpsrad_avx2(auVar11,auVar65);
  auVar50 = vpsrad_avx2(auVar121,auVar65);
  auVar25 = vpsrad_avx2(auVar25,auVar65);
  auVar97 = vpsrad_avx2(auVar73,auVar65);
  auVar72 = vpsrad_avx2(auVar72,auVar65);
  auVar121 = vpsrad_avx2(auVar74,auVar65);
  alVar34 = (__m256i)vpsrad_avx2(auVar13,auVar65);
  alVar35 = (__m256i)vpsrad_avx2(auVar75,auVar65);
  auVar13 = vpsrad_avx2(auVar14,auVar65);
  auVar14 = vpsrad_avx2(auVar122,auVar65);
  auVar15 = vpsrad_avx2(auVar15,auVar65);
  auVar51 = vpsrad_avx2(auVar53,auVar65);
  auVar76 = vpsrad_avx2(auVar76,auVar65);
  auVar67 = vpsrad_avx2(auVar77,auVar65);
  auVar20 = vpsrad_avx2(auVar20,auVar65);
  alVar36 = (__m256i)vpsrad_avx2(auVar78,auVar65);
  alVar37 = (__m256i)vpsrad_avx2(auVar21,auVar65);
  alVar38 = (__m256i)vpsrad_avx2(auVar52,auVar65);
  alVar39 = (__m256i)vpsrad_avx2(auVar26,auVar65);
  alVar40 = (__m256i)vpsrad_avx2(auVar54,auVar65);
  alVar41 = (__m256i)vpsrad_avx2(auVar80,auVar65);
  alVar42 = (__m256i)vpsrad_avx2(auVar79,auVar65);
  *output = alVar29;
  output[(uint)(instride * 0x3f)] = alVar33;
  output[(uint)instride] = alVar32;
  output[(uint)(instride * 0x3e)] = alVar31;
  output[(uint)(instride * 2)] = alVar30;
  output[(uint)(instride * 0x3d)] = alVar41;
  output[(uint)(instride * 3)] = alVar42;
  local_198 = auVar43._0_8_;
  lStack_190 = auVar43._8_8_;
  lStack_188 = auVar43._16_8_;
  lStack_180 = auVar43._24_8_;
  palVar1 = output + (uint)(instride * 0x3c);
  (*palVar1)[0] = local_198;
  (*palVar1)[1] = lStack_190;
  (*palVar1)[2] = lStack_188;
  (*palVar1)[3] = lStack_180;
  local_658 = auVar135._0_8_;
  lStack_650 = auVar135._8_8_;
  lStack_648 = auVar135._16_8_;
  lStack_640 = auVar135._24_8_;
  palVar1 = output + (uint)(instride * 4);
  (*palVar1)[0] = local_658;
  (*palVar1)[1] = lStack_650;
  (*palVar1)[2] = lStack_648;
  (*palVar1)[3] = lStack_640;
  output[(uint)(instride * 0x3b)] = alVar35;
  output[(uint)(instride * 5)] = alVar34;
  local_838 = auVar95._0_8_;
  lStack_830 = auVar95._8_8_;
  lStack_828 = auVar95._16_8_;
  lStack_820 = auVar95._24_8_;
  palVar1 = output + (uint)(instride * 0x3a);
  (*palVar1)[0] = local_838;
  (*palVar1)[1] = lStack_830;
  (*palVar1)[2] = lStack_828;
  (*palVar1)[3] = lStack_820;
  local_818 = auVar47._0_8_;
  lStack_810 = auVar47._8_8_;
  lStack_808 = auVar47._16_8_;
  lStack_800 = auVar47._24_8_;
  palVar1 = output + (uint)(instride * 6);
  (*palVar1)[0] = local_818;
  (*palVar1)[1] = lStack_810;
  (*palVar1)[2] = lStack_808;
  (*palVar1)[3] = lStack_800;
  local_6d8 = auVar72._0_8_;
  lStack_6d0 = auVar72._8_8_;
  lStack_6c8 = auVar72._16_8_;
  lStack_6c0 = auVar72._24_8_;
  palVar1 = output + (uint)(instride * 0x39);
  (*palVar1)[0] = local_6d8;
  (*palVar1)[1] = lStack_6d0;
  (*palVar1)[2] = lStack_6c8;
  (*palVar1)[3] = lStack_6c0;
  local_6b8 = auVar121._0_8_;
  lStack_6b0 = auVar121._8_8_;
  lStack_6a8 = auVar121._16_8_;
  lStack_6a0 = auVar121._24_8_;
  palVar1 = output + (uint)(instride * 7);
  (*palVar1)[0] = local_6b8;
  (*palVar1)[1] = lStack_6b0;
  (*palVar1)[2] = lStack_6a8;
  (*palVar1)[3] = lStack_6a0;
  local_898 = auVar7._0_8_;
  lStack_890 = auVar7._8_8_;
  lStack_888 = auVar7._16_8_;
  lStack_880 = auVar7._24_8_;
  palVar1 = output + (uint)(instride * 0x38);
  (*palVar1)[0] = local_898;
  (*palVar1)[1] = lStack_890;
  (*palVar1)[2] = lStack_888;
  (*palVar1)[3] = lStack_880;
  local_878 = auVar19._0_8_;
  lStack_870 = auVar19._8_8_;
  lStack_868 = auVar19._16_8_;
  lStack_860 = auVar19._24_8_;
  palVar1 = output + (uint)(instride * 8);
  (*palVar1)[0] = local_878;
  (*palVar1)[1] = lStack_870;
  (*palVar1)[2] = lStack_868;
  (*palVar1)[3] = lStack_860;
  local_5d8 = auVar96._0_8_;
  lStack_5d0 = auVar96._8_8_;
  lStack_5c8 = auVar96._16_8_;
  lStack_5c0 = auVar96._24_8_;
  palVar1 = output + (uint)(instride * 0x37);
  (*palVar1)[0] = local_5d8;
  (*palVar1)[1] = lStack_5d0;
  (*palVar1)[2] = lStack_5c8;
  (*palVar1)[3] = lStack_5c0;
  local_5b8 = auVar10._0_8_;
  lStack_5b0 = auVar10._8_8_;
  lStack_5a8 = auVar10._16_8_;
  lStack_5a0 = auVar10._24_8_;
  palVar1 = output + (uint)(instride * 9);
  (*palVar1)[0] = local_5b8;
  (*palVar1)[1] = lStack_5b0;
  (*palVar1)[2] = lStack_5a8;
  (*palVar1)[3] = lStack_5a0;
  local_558 = auVar45._0_8_;
  lStack_550 = auVar45._8_8_;
  lStack_548 = auVar45._16_8_;
  lStack_540 = auVar45._24_8_;
  palVar1 = output + (uint)(instride * 0x36);
  (*palVar1)[0] = local_558;
  (*palVar1)[1] = lStack_550;
  (*palVar1)[2] = lStack_548;
  (*palVar1)[3] = lStack_540;
  local_538 = auVar5._0_8_;
  lStack_530 = auVar5._8_8_;
  lStack_528 = auVar5._16_8_;
  lStack_520 = auVar5._24_8_;
  palVar1 = output + (uint)(instride * 10);
  (*palVar1)[0] = local_538;
  (*palVar1)[1] = lStack_530;
  (*palVar1)[2] = lStack_528;
  (*palVar1)[3] = lStack_520;
  local_598 = auVar76._0_8_;
  lStack_590 = auVar76._8_8_;
  lStack_588 = auVar76._16_8_;
  lStack_580 = auVar76._24_8_;
  palVar1 = output + (uint)(instride * 0x35);
  (*palVar1)[0] = local_598;
  (*palVar1)[1] = lStack_590;
  (*palVar1)[2] = lStack_588;
  (*palVar1)[3] = lStack_580;
  local_578 = auVar67._0_8_;
  lStack_570 = auVar67._8_8_;
  lStack_568 = auVar67._16_8_;
  lStack_560 = auVar67._24_8_;
  palVar1 = output + (uint)(instride * 0xb);
  (*palVar1)[0] = local_578;
  (*palVar1)[1] = lStack_570;
  (*palVar1)[2] = lStack_568;
  (*palVar1)[3] = lStack_560;
  local_758 = auVar86._0_8_;
  lStack_750 = auVar86._8_8_;
  lStack_748 = auVar86._16_8_;
  lStack_740 = auVar86._24_8_;
  palVar1 = output + (uint)(instride * 0x34);
  (*palVar1)[0] = local_758;
  (*palVar1)[1] = lStack_750;
  (*palVar1)[2] = lStack_748;
  (*palVar1)[3] = lStack_740;
  local_858 = auVar81._0_8_;
  lStack_850 = auVar81._8_8_;
  lStack_848 = auVar81._16_8_;
  lStack_840 = auVar81._24_8_;
  palVar1 = output + (uint)(instride * 0xc);
  (*palVar1)[0] = local_858;
  (*palVar1)[1] = lStack_850;
  (*palVar1)[2] = lStack_848;
  (*palVar1)[3] = lStack_840;
  output[(uint)(instride * 0x33)] = alVar36;
  local_298 = auVar20._0_8_;
  lStack_290 = auVar20._8_8_;
  lStack_288 = auVar20._16_8_;
  lStack_280 = auVar20._24_8_;
  palVar1 = output + (uint)(instride * 0xd);
  (*palVar1)[0] = local_298;
  (*palVar1)[1] = lStack_290;
  (*palVar1)[2] = lStack_288;
  (*palVar1)[3] = lStack_280;
  local_4f8 = auVar91._0_8_;
  lStack_4f0 = auVar91._8_8_;
  lStack_4e8 = auVar91._16_8_;
  lStack_4e0 = auVar91._24_8_;
  palVar1 = output + (uint)(instride * 0x32);
  (*palVar1)[0] = local_4f8;
  (*palVar1)[1] = lStack_4f0;
  (*palVar1)[2] = lStack_4e8;
  (*palVar1)[3] = lStack_4e0;
  local_4b8 = auVar44._0_8_;
  lStack_4b0 = auVar44._8_8_;
  lStack_4a8 = auVar44._16_8_;
  lStack_4a0 = auVar44._24_8_;
  palVar1 = output + (uint)(instride * 0xe);
  (*palVar1)[0] = local_4b8;
  (*palVar1)[1] = lStack_4b0;
  (*palVar1)[2] = lStack_4a8;
  (*palVar1)[3] = lStack_4a0;
  local_518 = auVar68._0_8_;
  lStack_510 = auVar68._8_8_;
  lStack_508 = auVar68._16_8_;
  lStack_500 = auVar68._24_8_;
  palVar1 = output + (uint)(instride * 0x31);
  (*palVar1)[0] = local_518;
  (*palVar1)[1] = lStack_510;
  (*palVar1)[2] = lStack_508;
  (*palVar1)[3] = lStack_500;
  local_4d8 = auVar49._0_8_;
  lStack_4d0 = auVar49._8_8_;
  lStack_4c8 = auVar49._16_8_;
  lStack_4c0 = auVar49._24_8_;
  palVar1 = output + (uint)(instride * 0xf);
  (*palVar1)[0] = local_4d8;
  (*palVar1)[1] = lStack_4d0;
  (*palVar1)[2] = lStack_4c8;
  (*palVar1)[3] = lStack_4c0;
  local_698 = auVar18._0_8_;
  lStack_690 = auVar18._8_8_;
  lStack_688 = auVar18._16_8_;
  lStack_680 = auVar18._24_8_;
  palVar1 = output + (uint)(instride * 0x30);
  (*palVar1)[0] = local_698;
  (*palVar1)[1] = lStack_690;
  (*palVar1)[2] = lStack_688;
  (*palVar1)[3] = lStack_680;
  local_418 = auVar3._0_8_;
  lStack_410 = auVar3._8_8_;
  lStack_408 = auVar3._16_8_;
  lStack_400 = auVar3._24_8_;
  palVar1 = output + (uint)(instride * 0x10);
  (*palVar1)[0] = local_418;
  (*palVar1)[1] = lStack_410;
  (*palVar1)[2] = lStack_408;
  (*palVar1)[3] = lStack_400;
  local_498 = auVar48._0_8_;
  lStack_490 = auVar48._8_8_;
  lStack_488 = auVar48._16_8_;
  lStack_480 = auVar48._24_8_;
  palVar1 = output + (uint)(instride * 0x2f);
  (*palVar1)[0] = local_498;
  (*palVar1)[1] = lStack_490;
  (*palVar1)[2] = lStack_488;
  (*palVar1)[3] = lStack_480;
  local_478 = auVar23._0_8_;
  lStack_470 = auVar23._8_8_;
  lStack_468 = auVar23._16_8_;
  lStack_460 = auVar23._24_8_;
  palVar1 = output + (uint)(instride * 0x11);
  (*palVar1)[0] = local_478;
  (*palVar1)[1] = lStack_470;
  (*palVar1)[2] = lStack_468;
  (*palVar1)[3] = lStack_460;
  local_458 = auVar82._0_8_;
  lStack_450 = auVar82._8_8_;
  lStack_448 = auVar82._16_8_;
  lStack_440 = auVar82._24_8_;
  palVar1 = output + (uint)(instride * 0x2e);
  (*palVar1)[0] = local_458;
  (*palVar1)[1] = lStack_450;
  (*palVar1)[2] = lStack_448;
  (*palVar1)[3] = lStack_440;
  local_3f8 = auVar12._0_8_;
  lStack_3f0 = auVar12._8_8_;
  lStack_3e8 = auVar12._16_8_;
  lStack_3e0 = auVar12._24_8_;
  palVar1 = output + (uint)(instride * 0x12);
  (*palVar1)[0] = local_3f8;
  (*palVar1)[1] = lStack_3f0;
  (*palVar1)[2] = lStack_3e8;
  (*palVar1)[3] = lStack_3e0;
  output[(uint)(instride * 0x2d)] = alVar37;
  output[(uint)(instride * 0x13)] = alVar38;
  local_678 = auVar66._0_8_;
  lStack_670 = auVar66._8_8_;
  lStack_668 = auVar66._16_8_;
  lStack_660 = auVar66._24_8_;
  palVar1 = output + (uint)(instride * 0x2c);
  (*palVar1)[0] = local_678;
  (*palVar1)[1] = lStack_670;
  (*palVar1)[2] = lStack_668;
  (*palVar1)[3] = lStack_660;
  local_398 = auVar84._0_8_;
  lStack_390 = auVar84._8_8_;
  lStack_388 = auVar84._16_8_;
  lStack_380 = auVar84._24_8_;
  palVar1 = output + (uint)(instride * 0x14);
  (*palVar1)[0] = local_398;
  (*palVar1)[1] = lStack_390;
  (*palVar1)[2] = lStack_388;
  (*palVar1)[3] = lStack_380;
  local_438 = auVar51._0_8_;
  lStack_430 = auVar51._8_8_;
  lStack_428 = auVar51._16_8_;
  lStack_420 = auVar51._24_8_;
  palVar1 = output + (uint)(instride * 0x2b);
  (*palVar1)[0] = local_438;
  (*palVar1)[1] = lStack_430;
  (*palVar1)[2] = lStack_428;
  (*palVar1)[3] = lStack_420;
  local_3d8 = auVar15._0_8_;
  lStack_3d0 = auVar15._8_8_;
  lStack_3c8 = auVar15._16_8_;
  lStack_3c0 = auVar15._24_8_;
  palVar1 = output + (uint)(instride * 0x15);
  (*palVar1)[0] = local_3d8;
  (*palVar1)[1] = lStack_3d0;
  (*palVar1)[2] = lStack_3c8;
  (*palVar1)[3] = lStack_3c0;
  local_278 = auVar6._0_8_;
  lStack_270 = auVar6._8_8_;
  lStack_268 = auVar6._16_8_;
  lStack_260 = auVar6._24_8_;
  palVar1 = output + (uint)(instride * 0x2a);
  (*palVar1)[0] = local_278;
  (*palVar1)[1] = lStack_270;
  (*palVar1)[2] = lStack_268;
  (*palVar1)[3] = lStack_260;
  local_238 = auVar69._0_8_;
  lStack_230 = auVar69._8_8_;
  lStack_228 = auVar69._16_8_;
  lStack_220 = auVar69._24_8_;
  palVar1 = output + (uint)(instride * 0x16);
  (*palVar1)[0] = local_238;
  (*palVar1)[1] = lStack_230;
  (*palVar1)[2] = lStack_228;
  (*palVar1)[3] = lStack_220;
  local_3b8 = auVar11._0_8_;
  lStack_3b0 = auVar11._8_8_;
  lStack_3a8 = auVar11._16_8_;
  lStack_3a0 = auVar11._24_8_;
  palVar1 = output + (uint)(instride * 0x29);
  (*palVar1)[0] = local_3b8;
  (*palVar1)[1] = lStack_3b0;
  (*palVar1)[2] = lStack_3a8;
  (*palVar1)[3] = lStack_3a0;
  local_258 = auVar50._0_8_;
  lStack_250 = auVar50._8_8_;
  lStack_248 = auVar50._16_8_;
  lStack_240 = auVar50._24_8_;
  palVar1 = output + (uint)(instride * 0x17);
  (*palVar1)[0] = local_258;
  (*palVar1)[1] = lStack_250;
  (*palVar1)[2] = lStack_248;
  (*palVar1)[3] = lStack_240;
  local_378 = auVar24._0_8_;
  lStack_370 = auVar24._8_8_;
  lStack_368 = auVar24._16_8_;
  lStack_360 = auVar24._24_8_;
  palVar1 = output + (uint)(instride * 0x28);
  (*palVar1)[0] = local_378;
  (*palVar1)[1] = lStack_370;
  (*palVar1)[2] = lStack_368;
  (*palVar1)[3] = lStack_360;
  local_358 = auVar27._0_8_;
  lStack_350 = auVar27._8_8_;
  lStack_348 = auVar27._16_8_;
  lStack_340 = auVar27._24_8_;
  palVar1 = output + (uint)(instride * 0x18);
  (*palVar1)[0] = local_358;
  (*palVar1)[1] = lStack_350;
  (*palVar1)[2] = lStack_348;
  (*palVar1)[3] = lStack_340;
  local_218 = auVar97._0_8_;
  lStack_210 = auVar97._8_8_;
  lStack_208 = auVar97._16_8_;
  lStack_200 = auVar97._24_8_;
  palVar1 = output + (uint)(instride * 0x27);
  (*palVar1)[0] = local_218;
  (*palVar1)[1] = lStack_210;
  (*palVar1)[2] = lStack_208;
  (*palVar1)[3] = lStack_200;
  local_1f8 = auVar25._0_8_;
  lStack_1f0 = auVar25._8_8_;
  lStack_1e8 = auVar25._16_8_;
  lStack_1e0 = auVar25._24_8_;
  palVar1 = output + (uint)(instride * 0x19);
  (*palVar1)[0] = local_1f8;
  (*palVar1)[1] = lStack_1f0;
  (*palVar1)[2] = lStack_1e8;
  (*palVar1)[3] = lStack_1e0;
  local_318 = auVar46._0_8_;
  lStack_310 = auVar46._8_8_;
  lStack_308 = auVar46._16_8_;
  lStack_300 = auVar46._24_8_;
  palVar1 = output + (uint)(instride * 0x26);
  (*palVar1)[0] = local_318;
  (*palVar1)[1] = lStack_310;
  (*palVar1)[2] = lStack_308;
  (*palVar1)[3] = lStack_300;
  local_178 = auVar17._0_8_;
  lStack_170 = auVar17._8_8_;
  lStack_168 = auVar17._16_8_;
  lStack_160 = auVar17._24_8_;
  palVar1 = output + (uint)(instride * 0x1a);
  (*palVar1)[0] = local_178;
  (*palVar1)[1] = lStack_170;
  (*palVar1)[2] = lStack_168;
  (*palVar1)[3] = lStack_160;
  local_1d8 = auVar13._0_8_;
  lStack_1d0 = auVar13._8_8_;
  lStack_1c8 = auVar13._16_8_;
  lStack_1c0 = auVar13._24_8_;
  palVar1 = output + (uint)(instride * 0x25);
  (*palVar1)[0] = local_1d8;
  (*palVar1)[1] = lStack_1d0;
  (*palVar1)[2] = lStack_1c8;
  (*palVar1)[3] = lStack_1c0;
  local_338 = auVar14._0_8_;
  lStack_330 = auVar14._8_8_;
  lStack_328 = auVar14._16_8_;
  lStack_320 = auVar14._24_8_;
  palVar1 = output + (uint)(instride * 0x1b);
  (*palVar1)[0] = local_338;
  (*palVar1)[1] = lStack_330;
  (*palVar1)[2] = lStack_328;
  (*palVar1)[3] = lStack_320;
  local_158 = auVar8._0_8_;
  lStack_150 = auVar8._8_8_;
  lStack_148 = auVar8._16_8_;
  lStack_140 = auVar8._24_8_;
  palVar1 = output + (uint)(instride * 0x24);
  (*palVar1)[0] = local_158;
  (*palVar1)[1] = lStack_150;
  (*palVar1)[2] = lStack_148;
  (*palVar1)[3] = lStack_140;
  local_138 = auVar71._0_8_;
  lStack_130 = auVar71._8_8_;
  lStack_128 = auVar71._16_8_;
  lStack_120 = auVar71._24_8_;
  palVar1 = output + (uint)(instride * 0x1c);
  (*palVar1)[0] = local_138;
  (*palVar1)[1] = lStack_130;
  (*palVar1)[2] = lStack_128;
  (*palVar1)[3] = lStack_120;
  output[(uint)(instride * 0x23)] = alVar40;
  output[(uint)(instride * 0x1d)] = alVar39;
  local_f8 = auVar4._0_8_;
  lStack_f0 = auVar4._8_8_;
  lStack_e8 = auVar4._16_8_;
  lStack_e0 = auVar4._24_8_;
  palVar1 = output + (uint)(instride * 0x22);
  (*palVar1)[0] = local_f8;
  (*palVar1)[1] = lStack_f0;
  (*palVar1)[2] = lStack_e8;
  (*palVar1)[3] = lStack_e0;
  local_b8 = auVar22._0_8_;
  lStack_b0 = auVar22._8_8_;
  lStack_a8 = auVar22._16_8_;
  lStack_a0 = auVar22._24_8_;
  palVar1 = output + (uint)(instride * 0x1e);
  (*palVar1)[0] = local_b8;
  (*palVar1)[1] = lStack_b0;
  (*palVar1)[2] = lStack_a8;
  (*palVar1)[3] = lStack_a0;
  local_118 = auVar9._0_8_;
  lStack_110 = auVar9._8_8_;
  lStack_108 = auVar9._16_8_;
  lStack_100 = auVar9._24_8_;
  palVar1 = output + (uint)(instride * 0x21);
  (*palVar1)[0] = local_118;
  (*palVar1)[1] = lStack_110;
  (*palVar1)[2] = lStack_108;
  (*palVar1)[3] = lStack_100;
  local_d8 = auVar28._0_8_;
  lStack_d0 = auVar28._8_8_;
  lStack_c8 = auVar28._16_8_;
  lStack_c0 = auVar28._24_8_;
  palVar1 = output + (uint)(instride * 0x1f);
  (*palVar1)[0] = local_d8;
  (*palVar1)[1] = lStack_d0;
  (*palVar1)[2] = lStack_c8;
  (*palVar1)[3] = lStack_c0;
  local_98 = auVar16._0_8_;
  lStack_90 = auVar16._8_8_;
  lStack_88 = auVar16._16_8_;
  lStack_80 = auVar16._24_8_;
  palVar1 = output + (uint)(instride * 0x20);
  (*palVar1)[0] = local_98;
  (*palVar1)[1] = lStack_90;
  (*palVar1)[2] = lStack_88;
  (*palVar1)[3] = lStack_80;
  return;
}

Assistant:

static void fdct64_avx2(__m256i *input, __m256i *output, int8_t cos_bit,
                        const int instride, const int outstride) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i __rounding = _mm256_set1_epi32(1 << (cos_bit - 1));
  __m256i cospi_m32 = _mm256_set1_epi32(-cospi[32]);
  __m256i cospi_p32 = _mm256_set1_epi32(cospi[32]);
  __m256i cospi_m16 = _mm256_set1_epi32(-cospi[16]);
  __m256i cospi_p48 = _mm256_set1_epi32(cospi[48]);
  __m256i cospi_m48 = _mm256_set1_epi32(-cospi[48]);
  __m256i cospi_p16 = _mm256_set1_epi32(cospi[16]);
  __m256i cospi_m08 = _mm256_set1_epi32(-cospi[8]);
  __m256i cospi_p56 = _mm256_set1_epi32(cospi[56]);
  __m256i cospi_m56 = _mm256_set1_epi32(-cospi[56]);
  __m256i cospi_m40 = _mm256_set1_epi32(-cospi[40]);
  __m256i cospi_p24 = _mm256_set1_epi32(cospi[24]);
  __m256i cospi_m24 = _mm256_set1_epi32(-cospi[24]);
  __m256i cospi_p08 = _mm256_set1_epi32(cospi[8]);
  __m256i cospi_p40 = _mm256_set1_epi32(cospi[40]);

  int startidx = 0 * instride;
  int endidx = 63 * instride;
  // stage 1
  __m256i x1[64];
  x1[0] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[63] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[1] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[62] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[2] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[61] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[3] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[60] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[4] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[59] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[5] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[58] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[6] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[57] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[7] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[56] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[8] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[55] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[9] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[54] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[10] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[53] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[11] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[52] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[12] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[51] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[13] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[50] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[14] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[49] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[15] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[48] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[16] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[47] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[17] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[46] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[18] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[45] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[19] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[44] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[20] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[43] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[21] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[42] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[22] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[41] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[23] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[40] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[24] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[39] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[25] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[38] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[26] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[37] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[27] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[36] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[28] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[35] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[29] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[34] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[30] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[33] = _mm256_sub_epi32(input[startidx], input[endidx]);
  startidx += instride;
  endidx -= instride;
  x1[31] = _mm256_add_epi32(input[startidx], input[endidx]);
  x1[32] = _mm256_sub_epi32(input[startidx], input[endidx]);

  // stage 2
  __m256i x2[64];
  fdct64_stage2_avx2(x1, x2, &cospi_m32, &cospi_p32, &__rounding, cos_bit);
  // stage 3
  fdct64_stage3_avx2(x2, x1, &cospi_m32, &cospi_p32, &__rounding, cos_bit);
  // stage 4
  fdct64_stage4_avx2(x1, x2, &cospi_m32, &cospi_p32, &cospi_m16, &cospi_p48,
                     &cospi_m48, &__rounding, cos_bit);
  // stage 5
  fdct64_stage5_avx2(x2, x1, &cospi_m32, &cospi_p32, &cospi_m16, &cospi_p48,
                     &cospi_m48, &__rounding, cos_bit);
  // stage 6
  fdct64_stage6_avx2(x1, x2, &cospi_p16, &cospi_p32, &cospi_m16, &cospi_p48,
                     &cospi_m48, &cospi_m08, &cospi_p56, &cospi_m56, &cospi_m40,
                     &cospi_p24, &cospi_m24, &__rounding, cos_bit);
  // stage 7
  fdct64_stage7_avx2(x2, x1, &cospi_p08, &cospi_p56, &cospi_p40, &cospi_p24,
                     &cospi_m08, &cospi_m56, &cospi_m40, &cospi_m24,
                     &__rounding, cos_bit);
  // stage 8
  fdct64_stage8_avx2(x1, x2, cospi, &__rounding, cos_bit);
  // stage 9
  fdct64_stage9_avx2(x2, x1, cospi, &__rounding, cos_bit);
  // stage 10
  fdct64_stage10_avx2(x1, x2, cospi, &__rounding, cos_bit);

  startidx = 0 * outstride;
  endidx = 63 * outstride;

  // stage 11
  output[startidx] = x2[0];
  output[endidx] = x2[63];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[32];
  output[endidx] = x2[31];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[16];
  output[endidx] = x2[47];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[48];
  output[endidx] = x2[15];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[8];
  output[endidx] = x2[55];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[40];
  output[endidx] = x2[23];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[24];
  output[endidx] = x2[39];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[56];
  output[endidx] = x2[7];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[4];
  output[endidx] = x2[59];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[36];
  output[endidx] = x2[27];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[20];
  output[endidx] = x2[43];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[52];
  output[endidx] = x2[11];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[12];
  output[endidx] = x2[51];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[44];
  output[endidx] = x2[19];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[28];
  output[endidx] = x2[35];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[60];
  output[endidx] = x2[3];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[2];
  output[endidx] = x2[61];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[34];
  output[endidx] = x2[29];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[18];
  output[endidx] = x2[45];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[50];
  output[endidx] = x2[13];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[10];
  output[endidx] = x2[53];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[42];
  output[endidx] = x2[21];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[26];
  output[endidx] = x2[37];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[58];
  output[endidx] = x2[5];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[6];
  output[endidx] = x2[57];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[38];
  output[endidx] = x2[25];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[22];
  output[endidx] = x2[41];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[54];
  output[endidx] = x2[9];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[14];
  output[endidx] = x2[49];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[46];
  output[endidx] = x2[17];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[30];
  output[endidx] = x2[33];
  startidx += outstride;
  endidx -= outstride;
  output[startidx] = x2[62];
  output[endidx] = x2[1];
}